

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_8.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_table_striped_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  int iVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  parasail_result_t *ppVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  longlong lVar12;
  ulong uVar13;
  ulong uVar14;
  longlong lVar15;
  longlong lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  __m128i *palVar47;
  __m128i *palVar48;
  __m128i *palVar49;
  __m128i *palVar50;
  __m128i *palVar51;
  __m128i *palVar52;
  __m128i *palVar53;
  __m128i *palVar54;
  char cVar55;
  char cVar56;
  int iVar57;
  int iVar58;
  __m128i *ptr;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  int8_t *ptr_00;
  __m128i *palVar59;
  uint uVar60;
  int iVar61;
  int iVar62;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  int32_t in_R9D;
  byte bVar63;
  char cVar64;
  char cVar65;
  char cVar69;
  char cVar70;
  char cVar72;
  char cVar73;
  char cVar75;
  char cVar76;
  char cVar78;
  char cVar79;
  char cVar81;
  char cVar82;
  char cVar84;
  char cVar85;
  byte bVar86;
  char cVar87;
  char cVar88;
  ulong uVar66;
  byte bVar68;
  byte bVar71;
  byte bVar74;
  byte bVar77;
  byte bVar80;
  byte bVar83;
  byte bVar89;
  char cVar90;
  char cVar91;
  byte bVar93;
  byte bVar96;
  byte bVar99;
  byte bVar102;
  byte bVar105;
  byte bVar108;
  undefined1 auVar67 [16];
  char cVar94;
  char cVar95;
  char cVar97;
  char cVar98;
  char cVar100;
  char cVar101;
  char cVar103;
  char cVar104;
  char cVar106;
  char cVar107;
  char cVar109;
  char cVar110;
  byte bVar111;
  char cVar112;
  char cVar113;
  ulong uVar92;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  __m128i alVar121;
  __m128i alVar122;
  __m128i alVar123;
  __m128i alVar124;
  __m128i alVar125;
  __m128i alVar126;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  __m128i alVar127;
  __m128i vH_04;
  __m128i vH_05;
  __m128i vH_06;
  ulong in_stack_ffffffffffffef98;
  long local_1058;
  long local_1050;
  ulong uStack_1038;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  __m128i cond;
  __m128i case2_1;
  __m128i case1_1;
  int8_t tmp2;
  int64_t tmp_6;
  __m128i vHp;
  __m128i case2;
  __m128i case1;
  __m128i *tmp_5;
  __m128i *tmp_4;
  __m128i *tmp_3;
  __m128i *tmp_2;
  __m128i *vPS;
  __m128i *vPM;
  __m128i *vP;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH_dag;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE;
  __m128i vEF_opn;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_8_t e;
  __m128i_8_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  char local_dbc;
  char local_dbb;
  char local_dba;
  char local_db9;
  int8_t length;
  int8_t similar;
  int8_t matches;
  int8_t score;
  __m128i vOne;
  __m128i vZero;
  int8_t POS_LIMIT;
  int8_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int8_t *boundary;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvHLLoad;
  __m128i *pvHLStore;
  __m128i *pvHSLoad;
  __m128i *pvHSStore;
  __m128i *pvHMLoad;
  __m128i *pvHMStore;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfileS;
  __m128i *vProfileM;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_cc8;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  char local_888;
  char cStack_887;
  char cStack_886;
  char cStack_885;
  char cStack_884;
  char cStack_883;
  char cStack_882;
  char cStack_881;
  char cStack_880;
  char cStack_87f;
  char cStack_87e;
  char cStack_87d;
  char cStack_87c;
  char cStack_87b;
  char cStack_87a;
  char cStack_879;
  char local_868;
  char cStack_867;
  char cStack_866;
  char cStack_865;
  char cStack_864;
  char cStack_863;
  char cStack_862;
  char cStack_861;
  char cStack_860;
  char cStack_85f;
  char cStack_85e;
  char cStack_85d;
  char cStack_85c;
  char cStack_85b;
  char cStack_85a;
  char cStack_859;
  char local_848;
  char cStack_847;
  char cStack_846;
  char cStack_845;
  char cStack_844;
  char cStack_843;
  char cStack_842;
  char cStack_841;
  char cStack_840;
  char cStack_83f;
  char cStack_83e;
  char cStack_83d;
  char cStack_83c;
  char cStack_83b;
  char cStack_83a;
  char cStack_839;
  char local_818;
  char cStack_817;
  char cStack_816;
  char cStack_815;
  char cStack_814;
  char cStack_813;
  char cStack_812;
  char cStack_811;
  char cStack_810;
  char cStack_80f;
  char cStack_80e;
  char cStack_80d;
  char cStack_80c;
  char cStack_80b;
  char cStack_80a;
  char cStack_809;
  byte local_808;
  byte bStack_807;
  byte bStack_806;
  byte bStack_805;
  byte bStack_804;
  byte bStack_803;
  byte bStack_802;
  byte bStack_801;
  byte bStack_800;
  byte bStack_7ff;
  byte bStack_7fe;
  byte bStack_7fd;
  byte bStack_7fc;
  byte bStack_7fb;
  byte bStack_7fa;
  byte bStack_7f9;
  char local_7f8;
  char cStack_7f7;
  char cStack_7f6;
  char cStack_7f5;
  char cStack_7f4;
  char cStack_7f3;
  char cStack_7f2;
  char cStack_7f1;
  char cStack_7f0;
  char cStack_7ef;
  char cStack_7ee;
  char cStack_7ed;
  char cStack_7ec;
  char cStack_7eb;
  char cStack_7ea;
  char cStack_7e9;
  char local_7e8;
  char cStack_7e7;
  char cStack_7e6;
  char cStack_7e5;
  char cStack_7e4;
  char cStack_7e3;
  char cStack_7e2;
  char cStack_7e1;
  char cStack_7e0;
  char cStack_7df;
  char cStack_7de;
  char cStack_7dd;
  char cStack_7dc;
  char cStack_7db;
  char cStack_7da;
  char cStack_7d9;
  char local_7c8;
  char cStack_7c7;
  char cStack_7c6;
  char cStack_7c5;
  char cStack_7c4;
  char cStack_7c3;
  char cStack_7c2;
  char cStack_7c1;
  char cStack_7c0;
  char cStack_7bf;
  char cStack_7be;
  char cStack_7bd;
  char cStack_7bc;
  char cStack_7bb;
  char cStack_7ba;
  char cStack_7b9;
  char local_7b8;
  char cStack_7b7;
  char cStack_7b6;
  char cStack_7b5;
  char cStack_7b4;
  char cStack_7b3;
  char cStack_7b2;
  char cStack_7b1;
  char cStack_7b0;
  char cStack_7af;
  char cStack_7ae;
  char cStack_7ad;
  char cStack_7ac;
  char cStack_7ab;
  char cStack_7aa;
  char cStack_7a9;
  char local_7a8;
  char cStack_7a7;
  char cStack_7a6;
  char cStack_7a5;
  char cStack_7a4;
  char cStack_7a3;
  char cStack_7a2;
  char cStack_7a1;
  char cStack_7a0;
  char cStack_79f;
  char cStack_79e;
  char cStack_79d;
  char cStack_79c;
  char cStack_79b;
  char cStack_79a;
  char cStack_799;
  char local_788;
  char cStack_787;
  char cStack_786;
  char cStack_785;
  char cStack_784;
  char cStack_783;
  char cStack_782;
  char cStack_781;
  char cStack_780;
  char cStack_77f;
  char cStack_77e;
  char cStack_77d;
  char cStack_77c;
  char cStack_77b;
  char cStack_77a;
  char cStack_779;
  char local_768;
  char cStack_767;
  char cStack_766;
  char cStack_765;
  char cStack_764;
  char cStack_763;
  char cStack_762;
  char cStack_761;
  char cStack_760;
  char cStack_75f;
  char cStack_75e;
  char cStack_75d;
  char cStack_75c;
  char cStack_75b;
  char cStack_75a;
  char cStack_759;
  char local_738;
  char cStack_737;
  char cStack_736;
  char cStack_735;
  char cStack_734;
  char cStack_733;
  char cStack_732;
  char cStack_731;
  char cStack_730;
  char cStack_72f;
  char cStack_72e;
  char cStack_72d;
  char cStack_72c;
  char cStack_72b;
  char cStack_72a;
  char cStack_729;
  byte local_728;
  byte bStack_727;
  byte bStack_726;
  byte bStack_725;
  byte bStack_724;
  byte bStack_723;
  byte bStack_722;
  byte bStack_721;
  byte bStack_720;
  byte bStack_71f;
  byte bStack_71e;
  byte bStack_71d;
  byte bStack_71c;
  byte bStack_71b;
  byte bStack_71a;
  byte bStack_719;
  char local_708;
  char cStack_707;
  char cStack_706;
  char cStack_705;
  char cStack_704;
  char cStack_703;
  char cStack_702;
  char cStack_701;
  char cStack_700;
  char cStack_6ff;
  char cStack_6fe;
  char cStack_6fd;
  char cStack_6fc;
  char cStack_6fb;
  char cStack_6fa;
  char cStack_6f9;
  byte local_6f8;
  byte bStack_6f7;
  byte bStack_6f6;
  byte bStack_6f5;
  byte bStack_6f4;
  byte bStack_6f3;
  byte bStack_6f2;
  byte bStack_6f1;
  byte bStack_6f0;
  byte bStack_6ef;
  byte bStack_6ee;
  byte bStack_6ed;
  byte bStack_6ec;
  byte bStack_6eb;
  byte bStack_6ea;
  byte bStack_6e9;
  byte local_6a8;
  byte bStack_6a7;
  byte bStack_6a6;
  byte bStack_6a5;
  byte bStack_6a4;
  byte bStack_6a3;
  byte bStack_6a2;
  byte bStack_6a1;
  byte bStack_6a0;
  byte bStack_69f;
  byte bStack_69e;
  byte bStack_69d;
  byte bStack_69c;
  byte bStack_69b;
  byte bStack_69a;
  byte bStack_699;
  char local_2d8;
  char cStack_2d7;
  char cStack_2d6;
  char cStack_2d5;
  char cStack_2d4;
  char cStack_2d3;
  char cStack_2d2;
  char cStack_2d1;
  char cStack_2d0;
  char cStack_2cf;
  char cStack_2ce;
  char cStack_2cd;
  char cStack_2cc;
  char cStack_2cb;
  char cStack_2ca;
  char cStack_2c9;
  char local_2b8;
  char cStack_2b7;
  char cStack_2b6;
  char cStack_2b5;
  char cStack_2b4;
  char cStack_2b3;
  char cStack_2b2;
  char cStack_2b1;
  char cStack_2b0;
  char cStack_2af;
  char cStack_2ae;
  char cStack_2ad;
  char cStack_2ac;
  char cStack_2ab;
  char cStack_2aa;
  char cStack_2a9;
  char local_1f8;
  char cStack_1f7;
  char cStack_1f6;
  char cStack_1f5;
  char cStack_1f4;
  char cStack_1f3;
  char cStack_1f2;
  char cStack_1f1;
  char cStack_1f0;
  char cStack_1ef;
  char cStack_1ee;
  char cStack_1ed;
  char cStack_1ec;
  char cStack_1eb;
  char cStack_1ea;
  char cStack_1e9;
  char local_1c8;
  char cStack_1c7;
  char cStack_1c6;
  char cStack_1c5;
  char cStack_1c4;
  char cStack_1c3;
  char cStack_1c2;
  char cStack_1c1;
  char cStack_1c0;
  char cStack_1bf;
  char cStack_1be;
  char cStack_1bd;
  char cStack_1bc;
  char cStack_1bb;
  char cStack_1ba;
  char cStack_1b9;
  char local_1b8;
  char cStack_1b7;
  char cStack_1b6;
  char cStack_1b5;
  char cStack_1b4;
  char cStack_1b3;
  char cStack_1b2;
  char cStack_1b1;
  char cStack_1b0;
  char cStack_1af;
  char cStack_1ae;
  char cStack_1ad;
  char cStack_1ac;
  char cStack_1ab;
  char cStack_1aa;
  char cStack_1a9;
  ulong uStack_f0;
  char local_c8;
  char cStack_c7;
  char cStack_c6;
  char cStack_c5;
  char cStack_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  undefined1 local_98 [8];
  undefined1 local_90 [24];
  undefined1 local_78 [8];
  undefined1 local_70 [56];
  undefined1 local_38 [8];
  undefined1 local_30 [24];
  undefined1 local_18 [8];
  undefined1 local_10 [8];
  size_t len;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_striped_profile_sse41_128_8",
            "profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile8).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_striped_profile_sse41_128_8",
            "profile->profile8.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_striped_profile_sse41_128_8",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_table_striped_profile_sse41_128_8",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_striped_profile_sse41_128_8","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_table_striped_profile_sse41_128_8",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_table_striped_profile_sse41_128_8",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_table_striped_profile_sse41_128_8",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_cc8 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar3 = profile->matrix;
    iVar57 = (iVar1 + 0xf) / 0x10;
    iVar62 = (iVar1 + -1) % iVar57;
    pvVar4 = (profile->profile8).score;
    pvVar5 = (profile->profile8).matches;
    pvVar6 = (profile->profile8).similar;
    i._0_1_ = (char)open;
    local_90._0_3_ = CONCAT21(CONCAT11((char)i,(char)i),(char)i);
    local_98._0_3_ = CONCAT21(CONCAT11((char)i,(char)i),(char)i);
    uVar7 = CONCAT17((char)i,CONCAT16((char)i,CONCAT15((char)i,CONCAT14((char)i,CONCAT13((char)i,
                                                  local_98._0_3_)))));
    uVar10 = CONCAT17((char)i,CONCAT16((char)i,CONCAT15((char)i,CONCAT14((char)i,CONCAT13((char)i,
                                                  local_90._0_3_)))));
    j._0_1_ = (undefined1)gap;
    local_70._0_3_ = CONCAT21(CONCAT11((undefined1)j,(undefined1)j),(undefined1)j);
    local_78._0_3_ = CONCAT21(CONCAT11((undefined1)j,(undefined1)j),(undefined1)j);
    uVar8 = CONCAT17((undefined1)j,
                     CONCAT16((undefined1)j,
                              CONCAT15((undefined1)j,
                                       CONCAT14((undefined1)j,CONCAT13((undefined1)j,local_78._0_3_)
                                               ))));
    uVar11 = CONCAT17((undefined1)j,
                      CONCAT16((undefined1)j,
                               CONCAT15((undefined1)j,
                                        CONCAT14((undefined1)j,
                                                 CONCAT13((undefined1)j,local_70._0_3_)))));
    if (ppVar3->min <= -open) {
      i._0_1_ = -(char)ppVar3->min;
    }
    cVar55 = (char)i + -0x7f;
    cVar56 = ((byte)ppVar3->max ^ 0x7f) - 1;
    local_30._0_3_ = CONCAT21(CONCAT11(cVar55,cVar55),cVar55);
    local_38._0_3_ = CONCAT21(CONCAT11(cVar55,cVar55),cVar55);
    ppVar9 = (parasail_result_t *)
             CONCAT17(cVar55,CONCAT16(cVar55,CONCAT15(cVar55,CONCAT14(cVar55,CONCAT13(cVar55,
                                                  local_38._0_3_)))));
    lVar12 = CONCAT17(cVar55,CONCAT16(cVar55,CONCAT15(cVar55,CONCAT14(cVar55,CONCAT13(cVar55,
                                                  local_30._0_3_)))));
    local_10._0_3_ = CONCAT21(CONCAT11(cVar56,cVar56),cVar56);
    local_18._0_3_ = CONCAT21(CONCAT11(cVar56,cVar56),cVar56);
    vSaturationCheckMax[1] =
         CONCAT17(cVar56,CONCAT16(cVar56,CONCAT15(cVar56,CONCAT14(cVar56,CONCAT13(cVar56,local_18.
                                                  _0_3_)))));
    vSaturationCheckMin[0] =
         CONCAT17(cVar56,CONCAT16(cVar56,CONCAT15(cVar56,CONCAT14(cVar56,CONCAT13(cVar56,local_10.
                                                  _0_3_)))));
    result = ppVar9;
    vSaturationCheckMax[0] = lVar12;
    _segNum = (parasail_profile_t *)parasail_result_new_table3(iVar57 * 0x10,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x10110801;
      uVar60 = *(uint *)&_segNum->field_0xc | 0x20000;
      len = (size_t)uVar60;
      *(uint *)&_segNum->field_0xc = uVar60;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar57);
      pvHMStore = parasail_memalign___m128i(0x10,(long)iVar57);
      pvHMLoad = parasail_memalign___m128i(0x10,(long)iVar57);
      pvHSStore = parasail_memalign___m128i(0x10,(long)iVar57);
      pvHSLoad = parasail_memalign___m128i(0x10,(long)iVar57);
      pvHLStore = parasail_memalign___m128i(0x10,(long)iVar57);
      pvHLLoad = parasail_memalign___m128i(0x10,(long)iVar57);
      pvE = parasail_memalign___m128i(0x10,(long)iVar57);
      ptr = parasail_memalign___m128i(0x10,(long)iVar57);
      b = parasail_memalign___m128i(0x10,(long)iVar57);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar57);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar57);
      ptr_00 = parasail_memalign_int8_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int8_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar121[0] = (long)iVar57;
        alVar121[1] = extraout_RDX;
        parasail_memset___m128i(pvHMLoad,alVar121,len);
        alVar122[0] = (long)iVar57;
        alVar122[1] = extraout_RDX_00;
        parasail_memset___m128i(pvHSLoad,alVar122,len);
        alVar123[0] = (long)iVar57;
        alVar123[1] = extraout_RDX_01;
        parasail_memset___m128i(pvHLLoad,alVar123,len);
        alVar124[0] = (long)iVar57;
        alVar124[1] = extraout_RDX_02;
        parasail_memset___m128i(b,alVar124,len);
        alVar125[0] = (long)iVar57;
        alVar125[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,alVar125,len);
        alVar126[0] = (long)iVar57;
        alVar126[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,alVar126,len);
        h.m[1]._4_4_ = 0;
        for (k = 0; k < iVar57; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 0x10; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            local_1058 = (long)(-(gap * (h.m[1]._0_4_ * iVar57 + k)) - open);
            local_1050 = local_1058;
            if (local_1058 < -0x80) {
              local_1050 = -0x80;
            }
            e.v[(long)(int)h.m[1]._0_4_ + 8] = (int8_t)local_1050;
            local_1058 = local_1058 - open;
            if (local_1058 < -0x80) {
              local_1058 = -0x80;
            }
            *(char *)((long)&tmp + (long)(int)h.m[1]._0_4_) = (char)local_1058;
          }
          pvHLoad[(int)h.m[1]._4_4_][0] = e.m[1];
          pvHLoad[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = '\0';
        for (k = 1; k <= s2Len; k = k + 1) {
          iVar58 = -(gap * (k + -1)) - open;
          if (iVar58 < -0x80) {
            iVar58 = -0x80;
          }
          ptr_00[k] = (int8_t)iVar58;
        }
        for (s1Len = 0; palVar54 = pvHLoad, palVar53 = pvHMStore, palVar52 = pvHMLoad,
            palVar51 = pvHSStore, palVar50 = pvHSLoad, palVar49 = pvHLStore, palVar48 = pvHLLoad,
            palVar47 = pvE, s1Len < s2Len; s1Len = s1Len + 1) {
          stack0xfffffffffffff128 = ZEXT816(0);
          stack0xfffffffffffff118 = ZEXT816(0);
          vFL[0] = 0x101010101010101;
          vH[1] = 0x101010101010101;
          uVar66 = pvHLoad[iVar57 + -1][0];
          uVar92 = pvHMLoad[iVar57 + -1][0];
          uVar13 = pvHSLoad[iVar57 + -1][0];
          uVar14 = pvHLLoad[iVar57 + -1][0];
          vH[0] = pvHLoad[iVar57 + -1][1] << 8 | uVar66 >> 0x38;
          vHM[0] = pvHMLoad[iVar57 + -1][1] << 8 | uVar92 >> 0x38;
          vHS[1] = uVar92 << 8;
          vHS[0] = pvHSLoad[iVar57 + -1][1] << 8 | uVar13 >> 0x38;
          vHL[1] = uVar13 << 8;
          vHL[0] = pvHLLoad[iVar57 + -1][1] << 8 | uVar14 >> 0x38;
          vP = (__m128i *)(uVar14 << 8);
          vH_dag[1] = uVar66 << 8 | (ulong)(byte)ptr_00[s1Len];
          iVar61 = ppVar3->mapper[(byte)s2[s1Len]] * iVar57;
          iVar58 = ppVar3->mapper[(byte)s2[s1Len]];
          iVar2 = ppVar3->mapper[(byte)s2[s1Len]];
          pvHMStore = pvHLoad;
          pvHLoad = palVar53;
          pvHSStore = pvHMLoad;
          pvHMLoad = palVar51;
          pvHLStore = pvHSLoad;
          pvHSLoad = palVar49;
          pvE = pvHLLoad;
          pvHLLoad = palVar47;
          vF_ext[1] = (longlong)ppVar9;
          vF[0] = lVar12;
          for (k = 0; k < iVar57; k = k + 1) {
            palVar59 = ptr + k;
            lVar15 = (*palVar59)[0];
            lVar16 = (*palVar59)[1];
            alVar121 = *palVar59;
            alVar125 = b[k];
            alVar122 = b[k];
            alVar126 = b_00[k];
            alVar123 = b_00[k];
            alVar127 = b_01[k];
            alVar124 = b_01[k];
            auVar114._8_8_ = vH[0];
            auVar114._0_8_ = vH_dag[1];
            auVar67 = paddsb(auVar114,*(undefined1 (*) [16])
                                       ((long)pvVar4 + (long)k * 0x10 + (long)iVar61 * 0x10));
            local_6f8 = auVar67[0];
            bStack_6f7 = auVar67[1];
            bStack_6f6 = auVar67[2];
            bStack_6f5 = auVar67[3];
            bStack_6f4 = auVar67[4];
            bStack_6f3 = auVar67[5];
            bStack_6f2 = auVar67[6];
            bStack_6f1 = auVar67[7];
            bStack_6f0 = auVar67[8];
            bStack_6ef = auVar67[9];
            bStack_6ee = auVar67[10];
            bStack_6ed = auVar67[0xb];
            bStack_6ec = auVar67[0xc];
            bStack_6eb = auVar67[0xd];
            bStack_6ea = auVar67[0xe];
            bStack_6e9 = auVar67[0xf];
            local_708 = (char)lVar15;
            cStack_707 = (char)((ulong)lVar15 >> 8);
            cStack_706 = (char)((ulong)lVar15 >> 0x10);
            cStack_705 = (char)((ulong)lVar15 >> 0x18);
            cStack_704 = (char)((ulong)lVar15 >> 0x20);
            cStack_703 = (char)((ulong)lVar15 >> 0x28);
            cStack_702 = (char)((ulong)lVar15 >> 0x30);
            cStack_701 = (char)((ulong)lVar15 >> 0x38);
            cStack_700 = (char)lVar16;
            cStack_6ff = (char)((ulong)lVar16 >> 8);
            cStack_6fe = (char)((ulong)lVar16 >> 0x10);
            cStack_6fd = (char)((ulong)lVar16 >> 0x18);
            cStack_6fc = (char)((ulong)lVar16 >> 0x20);
            cStack_6fb = (char)((ulong)lVar16 >> 0x28);
            cStack_6fa = (char)((ulong)lVar16 >> 0x30);
            cStack_6f9 = (char)((ulong)lVar16 >> 0x38);
            bVar63 = ((char)local_6f8 < local_708) * local_708 |
                     ((char)local_6f8 >= local_708) * local_6f8;
            bVar68 = ((char)bStack_6f7 < cStack_707) * cStack_707 |
                     ((char)bStack_6f7 >= cStack_707) * bStack_6f7;
            bVar71 = ((char)bStack_6f6 < cStack_706) * cStack_706 |
                     ((char)bStack_6f6 >= cStack_706) * bStack_6f6;
            bVar74 = ((char)bStack_6f5 < cStack_705) * cStack_705 |
                     ((char)bStack_6f5 >= cStack_705) * bStack_6f5;
            bVar77 = ((char)bStack_6f4 < cStack_704) * cStack_704 |
                     ((char)bStack_6f4 >= cStack_704) * bStack_6f4;
            bVar80 = ((char)bStack_6f3 < cStack_703) * cStack_703 |
                     ((char)bStack_6f3 >= cStack_703) * bStack_6f3;
            bVar83 = ((char)bStack_6f2 < cStack_702) * cStack_702 |
                     ((char)bStack_6f2 >= cStack_702) * bStack_6f2;
            bVar86 = ((char)bStack_6f1 < cStack_701) * cStack_701 |
                     ((char)bStack_6f1 >= cStack_701) * bStack_6f1;
            bVar89 = ((char)bStack_6f0 < cStack_700) * cStack_700 |
                     ((char)bStack_6f0 >= cStack_700) * bStack_6f0;
            bVar93 = ((char)bStack_6ef < cStack_6ff) * cStack_6ff |
                     ((char)bStack_6ef >= cStack_6ff) * bStack_6ef;
            bVar96 = ((char)bStack_6ee < cStack_6fe) * cStack_6fe |
                     ((char)bStack_6ee >= cStack_6fe) * bStack_6ee;
            bVar99 = ((char)bStack_6ed < cStack_6fd) * cStack_6fd |
                     ((char)bStack_6ed >= cStack_6fd) * bStack_6ed;
            bVar102 = ((char)bStack_6ec < cStack_6fc) * cStack_6fc |
                      ((char)bStack_6ec >= cStack_6fc) * bStack_6ec;
            bVar105 = ((char)bStack_6eb < cStack_6fb) * cStack_6fb |
                      ((char)bStack_6eb >= cStack_6fb) * bStack_6eb;
            bVar108 = ((char)bStack_6ea < cStack_6fa) * cStack_6fa |
                      ((char)bStack_6ea >= cStack_6fa) * bStack_6ea;
            bVar111 = ((char)bStack_6e9 < cStack_6f9) * cStack_6f9 |
                      ((char)bStack_6e9 >= cStack_6f9) * bStack_6e9;
            local_728 = (byte)vF_ext[1];
            bStack_727 = (byte)((ulong)vF_ext[1] >> 8);
            bStack_726 = (byte)((ulong)vF_ext[1] >> 0x10);
            bStack_725 = (byte)((ulong)vF_ext[1] >> 0x18);
            bStack_724 = (byte)((ulong)vF_ext[1] >> 0x20);
            bStack_723 = (byte)((ulong)vF_ext[1] >> 0x28);
            bStack_722 = (byte)((ulong)vF_ext[1] >> 0x30);
            bStack_721 = (byte)((ulong)vF_ext[1] >> 0x38);
            bStack_720 = (byte)vF[0];
            bStack_71f = (byte)((ulong)vF[0] >> 8);
            bStack_71e = (byte)((ulong)vF[0] >> 0x10);
            bStack_71d = (byte)((ulong)vF[0] >> 0x18);
            bStack_71c = (byte)((ulong)vF[0] >> 0x20);
            bStack_71b = (byte)((ulong)vF[0] >> 0x28);
            bStack_71a = (byte)((ulong)vF[0] >> 0x30);
            bStack_719 = (byte)((ulong)vF[0] >> 0x38);
            bVar63 = ((char)bVar63 < (char)local_728) * local_728 |
                     ((char)bVar63 >= (char)local_728) * bVar63;
            bVar68 = ((char)bVar68 < (char)bStack_727) * bStack_727 |
                     ((char)bVar68 >= (char)bStack_727) * bVar68;
            bVar71 = ((char)bVar71 < (char)bStack_726) * bStack_726 |
                     ((char)bVar71 >= (char)bStack_726) * bVar71;
            bVar74 = ((char)bVar74 < (char)bStack_725) * bStack_725 |
                     ((char)bVar74 >= (char)bStack_725) * bVar74;
            bVar77 = ((char)bVar77 < (char)bStack_724) * bStack_724 |
                     ((char)bVar77 >= (char)bStack_724) * bVar77;
            bVar80 = ((char)bVar80 < (char)bStack_723) * bStack_723 |
                     ((char)bVar80 >= (char)bStack_723) * bVar80;
            bVar83 = ((char)bVar83 < (char)bStack_722) * bStack_722 |
                     ((char)bVar83 >= (char)bStack_722) * bVar83;
            bVar86 = ((char)bVar86 < (char)bStack_721) * bStack_721 |
                     ((char)bVar86 >= (char)bStack_721) * bVar86;
            bVar89 = ((char)bVar89 < (char)bStack_720) * bStack_720 |
                     ((char)bVar89 >= (char)bStack_720) * bVar89;
            bVar93 = ((char)bVar93 < (char)bStack_71f) * bStack_71f |
                     ((char)bVar93 >= (char)bStack_71f) * bVar93;
            bVar96 = ((char)bVar96 < (char)bStack_71e) * bStack_71e |
                     ((char)bVar96 >= (char)bStack_71e) * bVar96;
            bVar99 = ((char)bVar99 < (char)bStack_71d) * bStack_71d |
                     ((char)bVar99 >= (char)bStack_71d) * bVar99;
            bVar102 = ((char)bVar102 < (char)bStack_71c) * bStack_71c |
                      ((char)bVar102 >= (char)bStack_71c) * bVar102;
            bVar105 = ((char)bVar105 < (char)bStack_71b) * bStack_71b |
                      ((char)bVar105 >= (char)bStack_71b) * bVar105;
            bVar108 = ((char)bVar108 < (char)bStack_71a) * bStack_71a |
                      ((char)bVar108 >= (char)bStack_71a) * bVar108;
            bVar111 = ((char)bVar111 < (char)bStack_719) * bStack_719 |
                      ((char)bVar111 >= (char)bStack_719) * bVar111;
            vH_dag[1]._0_2_ = CONCAT11(bVar68,bVar63);
            vH_dag[1]._0_3_ = CONCAT12(bVar71,(undefined2)vH_dag[1]);
            vH_dag[1]._0_4_ = CONCAT13(bVar74,(undefined3)vH_dag[1]);
            vH_dag[1]._0_5_ = CONCAT14(bVar77,(undefined4)vH_dag[1]);
            vH_dag[1]._0_6_ = CONCAT15(bVar80,(undefined5)vH_dag[1]);
            vH_dag[1]._0_7_ = CONCAT16(bVar83,(undefined6)vH_dag[1]);
            vH_dag[1] = CONCAT17(bVar86,(undefined7)vH_dag[1]);
            vH[0]._0_2_ = CONCAT11(bVar93,bVar89);
            vH[0]._0_3_ = CONCAT12(bVar96,(undefined2)vH[0]);
            vH[0]._0_4_ = CONCAT13(bVar99,(undefined3)vH[0]);
            vH[0]._0_5_ = CONCAT14(bVar102,(undefined4)vH[0]);
            vH[0]._0_6_ = CONCAT15(bVar105,(undefined5)vH[0]);
            vH[0]._0_7_ = CONCAT16(bVar108,(undefined6)vH[0]);
            vH[0] = CONCAT17(bVar111,(undefined7)vH[0]);
            palVar53[k][0] = vH_dag[1];
            palVar53[k][1] = vH[0];
            cVar64 = -(bVar63 == local_6f8);
            cVar69 = -(bVar68 == bStack_6f7);
            cVar72 = -(bVar71 == bStack_6f6);
            cVar75 = -(bVar74 == bStack_6f5);
            cVar78 = -(bVar77 == bStack_6f4);
            cVar81 = -(bVar80 == bStack_6f3);
            cVar84 = -(bVar83 == bStack_6f2);
            cVar87 = -(bVar86 == bStack_6f1);
            cVar90 = -(bVar89 == bStack_6f0);
            cVar94 = -(bVar93 == bStack_6ef);
            cVar97 = -(bVar96 == bStack_6ee);
            cVar100 = -(bVar99 == bStack_6ed);
            cVar103 = -(bVar102 == bStack_6ec);
            cVar106 = -(bVar105 == bStack_6eb);
            cVar109 = -(bVar108 == bStack_6ea);
            cVar112 = -(bVar111 == bStack_6e9);
            cVar65 = -(bVar63 == local_728);
            cVar70 = -(bVar68 == bStack_727);
            cVar73 = -(bVar71 == bStack_726);
            cVar76 = -(bVar74 == bStack_725);
            cVar79 = -(bVar77 == bStack_724);
            cVar82 = -(bVar80 == bStack_723);
            cVar85 = -(bVar83 == bStack_722);
            cVar88 = -(bVar86 == bStack_721);
            cVar91 = -(bVar89 == bStack_720);
            cVar95 = -(bVar93 == bStack_71f);
            cVar98 = -(bVar96 == bStack_71e);
            cVar101 = -(bVar99 == bStack_71d);
            cVar104 = -(bVar102 == bStack_71c);
            cVar107 = -(bVar105 == bStack_71b);
            cVar110 = -(bVar108 == bStack_71a);
            cVar113 = -(bVar111 == bStack_719);
            auVar35[1] = cVar70;
            auVar35[0] = cVar65;
            auVar35[2] = cVar73;
            auVar35[3] = cVar76;
            auVar35[4] = cVar79;
            auVar35[5] = cVar82;
            auVar35[6] = cVar85;
            auVar35[7] = cVar88;
            auVar35[9] = cVar95;
            auVar35[8] = cVar91;
            auVar35[10] = cVar98;
            auVar35[0xb] = cVar101;
            auVar35[0xc] = cVar104;
            auVar35[0xd] = cVar107;
            auVar35[0xe] = cVar110;
            auVar35[0xf] = cVar113;
            auVar119 = pblendvb((undefined1  [16])alVar122,stack0xfffffffffffff128,auVar35);
            auVar67 = paddsb((undefined1  [16])stack0xfffffffffffff0d8,
                             *(undefined1 (*) [16])
                              ((long)pvVar5 + (long)k * 0x10 + (long)(iVar58 * iVar57) * 0x10));
            auVar34[1] = cVar69;
            auVar34[0] = cVar64;
            auVar34[2] = cVar72;
            auVar34[3] = cVar75;
            auVar34[4] = cVar78;
            auVar34[5] = cVar81;
            auVar34[6] = cVar84;
            auVar34[7] = cVar87;
            auVar34[9] = cVar94;
            auVar34[8] = cVar90;
            auVar34[10] = cVar97;
            auVar34[0xb] = cVar100;
            auVar34[0xc] = cVar103;
            auVar34[0xd] = cVar106;
            auVar34[0xe] = cVar109;
            auVar34[0xf] = cVar112;
            auVar114 = pblendvb(auVar119,auVar67,auVar34);
            vHS[1] = auVar114._0_8_;
            vHM[0] = auVar114._8_8_;
            palVar51[k][0] = vHS[1];
            palVar51[k][1] = vHM[0];
            auVar33[1] = cVar70;
            auVar33[0] = cVar65;
            auVar33[2] = cVar73;
            auVar33[3] = cVar76;
            auVar33[4] = cVar79;
            auVar33[5] = cVar82;
            auVar33[6] = cVar85;
            auVar33[7] = cVar88;
            auVar33[9] = cVar95;
            auVar33[8] = cVar91;
            auVar33[10] = cVar98;
            auVar33[0xb] = cVar101;
            auVar33[0xc] = cVar104;
            auVar33[0xd] = cVar107;
            auVar33[0xe] = cVar110;
            auVar33[0xf] = cVar113;
            auVar119 = pblendvb((undefined1  [16])alVar123,stack0xfffffffffffff118,auVar33);
            auVar67 = paddsb((undefined1  [16])stack0xfffffffffffff0c8,
                             *(undefined1 (*) [16])
                              ((long)pvVar6 + (long)k * 0x10 + (long)(iVar2 * iVar57) * 0x10));
            auVar32[1] = cVar69;
            auVar32[0] = cVar64;
            auVar32[2] = cVar72;
            auVar32[3] = cVar75;
            auVar32[4] = cVar78;
            auVar32[5] = cVar81;
            auVar32[6] = cVar84;
            auVar32[7] = cVar87;
            auVar32[9] = cVar94;
            auVar32[8] = cVar90;
            auVar32[10] = cVar97;
            auVar32[0xb] = cVar100;
            auVar32[0xc] = cVar103;
            auVar32[0xd] = cVar106;
            auVar32[0xe] = cVar109;
            auVar32[0xf] = cVar112;
            auVar115 = pblendvb(auVar119,auVar67,auVar32);
            vHL[1] = auVar115._0_8_;
            vHS[0] = auVar115._8_8_;
            palVar49[k][0] = vHL[1];
            palVar49[k][1] = vHS[0];
            auVar31[1] = cVar70;
            auVar31[0] = cVar65;
            auVar31[2] = cVar73;
            auVar31[3] = cVar76;
            auVar31[4] = cVar79;
            auVar31[5] = cVar82;
            auVar31[6] = cVar85;
            auVar31[7] = cVar88;
            auVar31[9] = cVar95;
            auVar31[8] = cVar91;
            auVar31[10] = cVar98;
            auVar31[0xb] = cVar101;
            auVar31[0xc] = cVar104;
            auVar31[0xd] = cVar107;
            auVar31[0xe] = cVar110;
            auVar31[0xf] = cVar113;
            auVar119 = pblendvb((undefined1  [16])alVar124,stack0xfffffffffffff108,auVar31);
            auVar116._8_8_ = 0x101010101010101;
            auVar116._0_8_ = 0x101010101010101;
            auVar67 = paddsb((undefined1  [16])_vP,auVar116);
            auVar30[1] = cVar69;
            auVar30[0] = cVar64;
            auVar30[2] = cVar72;
            auVar30[3] = cVar75;
            auVar30[4] = cVar78;
            auVar30[5] = cVar81;
            auVar30[6] = cVar84;
            auVar30[7] = cVar87;
            auVar30[9] = cVar94;
            auVar30[8] = cVar90;
            auVar30[10] = cVar97;
            auVar30[0xb] = cVar100;
            auVar30[0xc] = cVar103;
            auVar30[0xd] = cVar106;
            auVar30[0xe] = cVar109;
            auVar30[0xf] = cVar112;
            auVar116 = pblendvb(auVar119,auVar67,auVar30);
            vP = auVar116._0_8_;
            vHL[0] = auVar116._8_8_;
            palVar47[k][0] = (longlong)vP;
            palVar47[k][1] = vHL[0];
            local_2b8 = (char)vSaturationCheckMax[1];
            cStack_2b7 = (char)((ulong)vSaturationCheckMax[1] >> 8);
            cStack_2b6 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
            cStack_2b5 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
            cStack_2b4 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
            cStack_2b3 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
            cStack_2b2 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
            cStack_2b1 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
            cStack_2b0 = (char)vSaturationCheckMin[0];
            cStack_2af = (char)((ulong)vSaturationCheckMin[0] >> 8);
            cStack_2ae = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
            cStack_2ad = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
            cStack_2ac = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
            cStack_2ab = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
            cStack_2aa = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
            cStack_2a9 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
            vSaturationCheckMax[1]._0_2_ =
                 CONCAT11(((char)bVar68 < cStack_2b7) * bVar68 |
                          ((char)bVar68 >= cStack_2b7) * cStack_2b7,
                          ((char)bVar63 < local_2b8) * bVar63 |
                          ((char)bVar63 >= local_2b8) * local_2b8);
            vSaturationCheckMax[1]._0_3_ =
                 CONCAT12(((char)bVar71 < cStack_2b6) * bVar71 |
                          ((char)bVar71 >= cStack_2b6) * cStack_2b6,
                          (undefined2)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_4_ =
                 CONCAT13(((char)bVar74 < cStack_2b5) * bVar74 |
                          ((char)bVar74 >= cStack_2b5) * cStack_2b5,
                          (undefined3)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_5_ =
                 CONCAT14(((char)bVar77 < cStack_2b4) * bVar77 |
                          ((char)bVar77 >= cStack_2b4) * cStack_2b4,
                          (undefined4)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_6_ =
                 CONCAT15(((char)bVar80 < cStack_2b3) * bVar80 |
                          ((char)bVar80 >= cStack_2b3) * cStack_2b3,
                          (undefined5)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_7_ =
                 CONCAT16(((char)bVar83 < cStack_2b2) * bVar83 |
                          ((char)bVar83 >= cStack_2b2) * cStack_2b2,
                          (undefined6)vSaturationCheckMax[1]);
            vSaturationCheckMax[1] =
                 CONCAT17(((char)bVar86 < cStack_2b1) * bVar86 |
                          ((char)bVar86 >= cStack_2b1) * cStack_2b1,
                          (undefined7)vSaturationCheckMax[1]);
            vSaturationCheckMin[0]._0_2_ =
                 CONCAT11(((char)bVar93 < cStack_2af) * bVar93 |
                          ((char)bVar93 >= cStack_2af) * cStack_2af,
                          ((char)bVar89 < cStack_2b0) * bVar89 |
                          ((char)bVar89 >= cStack_2b0) * cStack_2b0);
            vSaturationCheckMin[0]._0_3_ =
                 CONCAT12(((char)bVar96 < cStack_2ae) * bVar96 |
                          ((char)bVar96 >= cStack_2ae) * cStack_2ae,
                          (undefined2)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_4_ =
                 CONCAT13(((char)bVar99 < cStack_2ad) * bVar99 |
                          ((char)bVar99 >= cStack_2ad) * cStack_2ad,
                          (undefined3)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_5_ =
                 CONCAT14(((char)bVar102 < cStack_2ac) * bVar102 |
                          ((char)bVar102 >= cStack_2ac) * cStack_2ac,
                          (undefined4)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_6_ =
                 CONCAT15(((char)bVar105 < cStack_2ab) * bVar105 |
                          ((char)bVar105 >= cStack_2ab) * cStack_2ab,
                          (undefined5)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_7_ =
                 CONCAT16(((char)bVar108 < cStack_2aa) * bVar108 |
                          ((char)bVar108 >= cStack_2aa) * cStack_2aa,
                          (undefined6)vSaturationCheckMin[0]);
            vSaturationCheckMin[0] =
                 CONCAT17(((char)bVar111 < cStack_2a9) * bVar111 |
                          ((char)bVar111 >= cStack_2a9) * cStack_2a9,
                          (undefined7)vSaturationCheckMin[0]);
            local_738 = (char)result;
            cStack_737 = (char)((ulong)result >> 8);
            cStack_736 = (char)((ulong)result >> 0x10);
            cStack_735 = (char)((ulong)result >> 0x18);
            cStack_734 = (char)((ulong)result >> 0x20);
            cStack_733 = (char)((ulong)result >> 0x28);
            cStack_732 = (char)((ulong)result >> 0x30);
            cStack_731 = (char)((ulong)result >> 0x38);
            cStack_730 = (char)vSaturationCheckMax[0];
            cStack_72f = (char)((ulong)vSaturationCheckMax[0] >> 8);
            cStack_72e = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
            cStack_72d = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
            cStack_72c = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
            cStack_72b = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
            cStack_72a = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
            cStack_729 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
            bVar63 = (local_738 < (char)bVar63) * bVar63 | (local_738 >= (char)bVar63) * local_738;
            bVar68 = (cStack_737 < (char)bVar68) * bVar68 |
                     (cStack_737 >= (char)bVar68) * cStack_737;
            bVar71 = (cStack_736 < (char)bVar71) * bVar71 |
                     (cStack_736 >= (char)bVar71) * cStack_736;
            bVar74 = (cStack_735 < (char)bVar74) * bVar74 |
                     (cStack_735 >= (char)bVar74) * cStack_735;
            bVar77 = (cStack_734 < (char)bVar77) * bVar77 |
                     (cStack_734 >= (char)bVar77) * cStack_734;
            bVar80 = (cStack_733 < (char)bVar80) * bVar80 |
                     (cStack_733 >= (char)bVar80) * cStack_733;
            bVar83 = (cStack_732 < (char)bVar83) * bVar83 |
                     (cStack_732 >= (char)bVar83) * cStack_732;
            bVar86 = (cStack_731 < (char)bVar86) * bVar86 |
                     (cStack_731 >= (char)bVar86) * cStack_731;
            bVar89 = (cStack_730 < (char)bVar89) * bVar89 |
                     (cStack_730 >= (char)bVar89) * cStack_730;
            bVar93 = (cStack_72f < (char)bVar93) * bVar93 |
                     (cStack_72f >= (char)bVar93) * cStack_72f;
            bVar96 = (cStack_72e < (char)bVar96) * bVar96 |
                     (cStack_72e >= (char)bVar96) * cStack_72e;
            bVar99 = (cStack_72d < (char)bVar99) * bVar99 |
                     (cStack_72d >= (char)bVar99) * cStack_72d;
            bVar102 = (cStack_72c < (char)bVar102) * bVar102 |
                      (cStack_72c >= (char)bVar102) * cStack_72c;
            bVar105 = (cStack_72b < (char)bVar105) * bVar105 |
                      (cStack_72b >= (char)bVar105) * cStack_72b;
            bVar108 = (cStack_72a < (char)bVar108) * bVar108 |
                      (cStack_72a >= (char)bVar108) * cStack_72a;
            bVar111 = (cStack_729 < (char)bVar111) * bVar111 |
                      (cStack_729 >= (char)bVar111) * cStack_729;
            local_768 = auVar114[0];
            cStack_767 = auVar114[1];
            cStack_766 = auVar114[2];
            cStack_765 = auVar114[3];
            cStack_764 = auVar114[4];
            cStack_763 = auVar114[5];
            cStack_762 = auVar114[6];
            cStack_761 = auVar114[7];
            cStack_760 = auVar114[8];
            cStack_75f = auVar114[9];
            cStack_75e = auVar114[10];
            cStack_75d = auVar114[0xb];
            cStack_75c = auVar114[0xc];
            cStack_75b = auVar114[0xd];
            cStack_75a = auVar114[0xe];
            cStack_759 = auVar114[0xf];
            bVar63 = ((char)bVar63 < local_768) * local_768 | ((char)bVar63 >= local_768) * bVar63;
            bVar68 = ((char)bVar68 < cStack_767) * cStack_767 |
                     ((char)bVar68 >= cStack_767) * bVar68;
            bVar71 = ((char)bVar71 < cStack_766) * cStack_766 |
                     ((char)bVar71 >= cStack_766) * bVar71;
            bVar74 = ((char)bVar74 < cStack_765) * cStack_765 |
                     ((char)bVar74 >= cStack_765) * bVar74;
            bVar77 = ((char)bVar77 < cStack_764) * cStack_764 |
                     ((char)bVar77 >= cStack_764) * bVar77;
            bVar80 = ((char)bVar80 < cStack_763) * cStack_763 |
                     ((char)bVar80 >= cStack_763) * bVar80;
            bVar83 = ((char)bVar83 < cStack_762) * cStack_762 |
                     ((char)bVar83 >= cStack_762) * bVar83;
            bVar86 = ((char)bVar86 < cStack_761) * cStack_761 |
                     ((char)bVar86 >= cStack_761) * bVar86;
            bVar89 = ((char)bVar89 < cStack_760) * cStack_760 |
                     ((char)bVar89 >= cStack_760) * bVar89;
            bVar93 = ((char)bVar93 < cStack_75f) * cStack_75f |
                     ((char)bVar93 >= cStack_75f) * bVar93;
            bVar96 = ((char)bVar96 < cStack_75e) * cStack_75e |
                     ((char)bVar96 >= cStack_75e) * bVar96;
            bVar99 = ((char)bVar99 < cStack_75d) * cStack_75d |
                     ((char)bVar99 >= cStack_75d) * bVar99;
            bVar102 = ((char)bVar102 < cStack_75c) * cStack_75c |
                      ((char)bVar102 >= cStack_75c) * bVar102;
            bVar105 = ((char)bVar105 < cStack_75b) * cStack_75b |
                      ((char)bVar105 >= cStack_75b) * bVar105;
            bVar108 = ((char)bVar108 < cStack_75a) * cStack_75a |
                      ((char)bVar108 >= cStack_75a) * bVar108;
            bVar111 = ((char)bVar111 < cStack_759) * cStack_759 |
                      ((char)bVar111 >= cStack_759) * bVar111;
            local_788 = auVar115[0];
            cStack_787 = auVar115[1];
            cStack_786 = auVar115[2];
            cStack_785 = auVar115[3];
            cStack_784 = auVar115[4];
            cStack_783 = auVar115[5];
            cStack_782 = auVar115[6];
            cStack_781 = auVar115[7];
            cStack_780 = auVar115[8];
            cStack_77f = auVar115[9];
            cStack_77e = auVar115[10];
            cStack_77d = auVar115[0xb];
            cStack_77c = auVar115[0xc];
            cStack_77b = auVar115[0xd];
            cStack_77a = auVar115[0xe];
            cStack_779 = auVar115[0xf];
            bVar63 = ((char)bVar63 < local_788) * local_788 | ((char)bVar63 >= local_788) * bVar63;
            bVar68 = ((char)bVar68 < cStack_787) * cStack_787 |
                     ((char)bVar68 >= cStack_787) * bVar68;
            bVar71 = ((char)bVar71 < cStack_786) * cStack_786 |
                     ((char)bVar71 >= cStack_786) * bVar71;
            bVar74 = ((char)bVar74 < cStack_785) * cStack_785 |
                     ((char)bVar74 >= cStack_785) * bVar74;
            bVar77 = ((char)bVar77 < cStack_784) * cStack_784 |
                     ((char)bVar77 >= cStack_784) * bVar77;
            bVar80 = ((char)bVar80 < cStack_783) * cStack_783 |
                     ((char)bVar80 >= cStack_783) * bVar80;
            bVar83 = ((char)bVar83 < cStack_782) * cStack_782 |
                     ((char)bVar83 >= cStack_782) * bVar83;
            bVar86 = ((char)bVar86 < cStack_781) * cStack_781 |
                     ((char)bVar86 >= cStack_781) * bVar86;
            bVar89 = ((char)bVar89 < cStack_780) * cStack_780 |
                     ((char)bVar89 >= cStack_780) * bVar89;
            bVar93 = ((char)bVar93 < cStack_77f) * cStack_77f |
                     ((char)bVar93 >= cStack_77f) * bVar93;
            bVar96 = ((char)bVar96 < cStack_77e) * cStack_77e |
                     ((char)bVar96 >= cStack_77e) * bVar96;
            bVar99 = ((char)bVar99 < cStack_77d) * cStack_77d |
                     ((char)bVar99 >= cStack_77d) * bVar99;
            bVar102 = ((char)bVar102 < cStack_77c) * cStack_77c |
                      ((char)bVar102 >= cStack_77c) * bVar102;
            bVar105 = ((char)bVar105 < cStack_77b) * cStack_77b |
                      ((char)bVar105 >= cStack_77b) * bVar105;
            bVar108 = ((char)bVar108 < cStack_77a) * cStack_77a |
                      ((char)bVar108 >= cStack_77a) * bVar108;
            bVar111 = ((char)bVar111 < cStack_779) * cStack_779 |
                      ((char)bVar111 >= cStack_779) * bVar111;
            local_7a8 = auVar116[0];
            cStack_7a7 = auVar116[1];
            cStack_7a6 = auVar116[2];
            cStack_7a5 = auVar116[3];
            cStack_7a4 = auVar116[4];
            cStack_7a3 = auVar116[5];
            cStack_7a2 = auVar116[6];
            cStack_7a1 = auVar116[7];
            cStack_7a0 = auVar116[8];
            cStack_79f = auVar116[9];
            cStack_79e = auVar116[10];
            cStack_79d = auVar116[0xb];
            cStack_79c = auVar116[0xc];
            cStack_79b = auVar116[0xd];
            cStack_79a = auVar116[0xe];
            cStack_799 = auVar116[0xf];
            result._0_2_ = CONCAT11(((char)bVar68 < cStack_7a7) * cStack_7a7 |
                                    ((char)bVar68 >= cStack_7a7) * bVar68,
                                    ((char)bVar63 < local_7a8) * local_7a8 |
                                    ((char)bVar63 >= local_7a8) * bVar63);
            result._0_3_ = CONCAT12(((char)bVar71 < cStack_7a6) * cStack_7a6 |
                                    ((char)bVar71 >= cStack_7a6) * bVar71,result._0_2_);
            result._0_4_ = CONCAT13(((char)bVar74 < cStack_7a5) * cStack_7a5 |
                                    ((char)bVar74 >= cStack_7a5) * bVar74,result._0_3_);
            result._0_5_ = CONCAT14(((char)bVar77 < cStack_7a4) * cStack_7a4 |
                                    ((char)bVar77 >= cStack_7a4) * bVar77,result._0_4_);
            result._0_6_ = CONCAT15(((char)bVar80 < cStack_7a3) * cStack_7a3 |
                                    ((char)bVar80 >= cStack_7a3) * bVar80,result._0_5_);
            result._0_7_ = CONCAT16(((char)bVar83 < cStack_7a2) * cStack_7a2 |
                                    ((char)bVar83 >= cStack_7a2) * bVar83,result._0_6_);
            result = (parasail_result_t *)
                     CONCAT17(((char)bVar86 < cStack_7a1) * cStack_7a1 |
                              ((char)bVar86 >= cStack_7a1) * bVar86,result._0_7_);
            vSaturationCheckMax[0]._0_2_ =
                 CONCAT11(((char)bVar93 < cStack_79f) * cStack_79f |
                          ((char)bVar93 >= cStack_79f) * bVar93,
                          ((char)bVar89 < cStack_7a0) * cStack_7a0 |
                          ((char)bVar89 >= cStack_7a0) * bVar89);
            vSaturationCheckMax[0]._0_3_ =
                 CONCAT12(((char)bVar96 < cStack_79e) * cStack_79e |
                          ((char)bVar96 >= cStack_79e) * bVar96,(undefined2)vSaturationCheckMax[0]);
            vSaturationCheckMax[0]._0_4_ =
                 CONCAT13(((char)bVar99 < cStack_79d) * cStack_79d |
                          ((char)bVar99 >= cStack_79d) * bVar99,(undefined3)vSaturationCheckMax[0]);
            vSaturationCheckMax[0]._0_5_ =
                 CONCAT14(((char)bVar102 < cStack_79c) * cStack_79c |
                          ((char)bVar102 >= cStack_79c) * bVar102,(undefined4)vSaturationCheckMax[0]
                         );
            vSaturationCheckMax[0]._0_6_ =
                 CONCAT15(((char)bVar105 < cStack_79b) * cStack_79b |
                          ((char)bVar105 >= cStack_79b) * bVar105,(undefined5)vSaturationCheckMax[0]
                         );
            vSaturationCheckMax[0]._0_7_ =
                 CONCAT16(((char)bVar108 < cStack_79a) * cStack_79a |
                          ((char)bVar108 >= cStack_79a) * bVar108,(undefined6)vSaturationCheckMax[0]
                         );
            vSaturationCheckMax[0] =
                 CONCAT17(((char)bVar111 < cStack_799) * cStack_799 |
                          ((char)bVar111 >= cStack_799) * bVar111,(undefined7)vSaturationCheckMax[0]
                         );
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = iVar57;
            vH_00[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &_segNum->matrix)->trace->trace_del_table + 8),vH_00,
                            s1Len,s2Len,in_R9D,(int32_t)in_stack_ffffffffffffef98);
            vH_01[0] = (ulong)(uint)k;
            vH_01[1]._0_4_ = iVar57;
            vH_01[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &_segNum->matrix)->trace->trace_del_table + 0x10),vH_01,
                            s1Len,s2Len,in_R9D,(int32_t)in_stack_ffffffffffffef98);
            vH_02[0] = (ulong)(uint)k;
            vH_02[1]._0_4_ = iVar57;
            vH_02[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &_segNum->matrix)->trace->trace_del_table + 0x18),vH_02,
                            s1Len,s2Len,in_R9D,(int32_t)in_stack_ffffffffffffef98);
            vH_03[0] = (ulong)(uint)k;
            vH_03[1]._0_4_ = iVar57;
            vH_03[1]._4_4_ = 0;
            arr_store_si128(*((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                             trace->trace_del_table,vH_03,s1Len,s2Len,in_R9D,
                            (int32_t)in_stack_ffffffffffffef98);
            auVar44._8_8_ = vH[0];
            auVar44._0_8_ = vH_dag[1];
            auVar43._8_8_ = uVar10;
            auVar43._0_8_ = uVar7;
            auVar67 = psubsb(auVar44,auVar43);
            auVar42._8_8_ = uVar11;
            auVar42._0_8_ = uVar8;
            auVar119 = psubsb((undefined1  [16])alVar121,auVar42);
            local_7b8 = auVar67[0];
            cStack_7b7 = auVar67[1];
            cStack_7b6 = auVar67[2];
            cStack_7b5 = auVar67[3];
            cStack_7b4 = auVar67[4];
            cStack_7b3 = auVar67[5];
            cStack_7b2 = auVar67[6];
            cStack_7b1 = auVar67[7];
            cStack_7b0 = auVar67[8];
            cStack_7af = auVar67[9];
            cStack_7ae = auVar67[10];
            cStack_7ad = auVar67[0xb];
            cStack_7ac = auVar67[0xc];
            cStack_7ab = auVar67[0xd];
            cStack_7aa = auVar67[0xe];
            cStack_7a9 = auVar67[0xf];
            local_7c8 = auVar119[0];
            cStack_7c7 = auVar119[1];
            cStack_7c6 = auVar119[2];
            cStack_7c5 = auVar119[3];
            cStack_7c4 = auVar119[4];
            cStack_7c3 = auVar119[5];
            cStack_7c2 = auVar119[6];
            cStack_7c1 = auVar119[7];
            cStack_7c0 = auVar119[8];
            cStack_7bf = auVar119[9];
            cStack_7be = auVar119[10];
            cStack_7bd = auVar119[0xb];
            cStack_7bc = auVar119[0xc];
            cStack_7bb = auVar119[0xd];
            cStack_7ba = auVar119[0xe];
            cStack_7b9 = auVar119[0xf];
            vE_ext[1] = CONCAT17((cStack_7b1 < cStack_7c1) * cStack_7c1 |
                                 (cStack_7b1 >= cStack_7c1) * cStack_7b1,
                                 CONCAT16((cStack_7b2 < cStack_7c2) * cStack_7c2 |
                                          (cStack_7b2 >= cStack_7c2) * cStack_7b2,
                                          CONCAT15((cStack_7b3 < cStack_7c3) * cStack_7c3 |
                                                   (cStack_7b3 >= cStack_7c3) * cStack_7b3,
                                                   CONCAT14((cStack_7b4 < cStack_7c4) * cStack_7c4 |
                                                            (cStack_7b4 >= cStack_7c4) * cStack_7b4,
                                                            CONCAT13((cStack_7b5 < cStack_7c5) *
                                                                     cStack_7c5 |
                                                                     (cStack_7b5 >= cStack_7c5) *
                                                                     cStack_7b5,
                                                                     CONCAT12((cStack_7b6 <
                                                                              cStack_7c6) *
                                                                              cStack_7c6 |
                                                                              (cStack_7b6 >=
                                                                              cStack_7c6) *
                                                                              cStack_7b6,
                                                                              CONCAT11((cStack_7b7 <
                                                                                       cStack_7c7) *
                                                                                       cStack_7c7 |
                                                                                       (cStack_7b7
                                                                                       >= cStack_7c7
                                                                                       ) * 
                                                  cStack_7b7,
                                                  (local_7b8 < local_7c8) * local_7c8 |
                                                  (local_7b8 >= local_7c8) * local_7b8)))))));
            vE[0] = CONCAT17((cStack_7a9 < cStack_7b9) * cStack_7b9 |
                             (cStack_7a9 >= cStack_7b9) * cStack_7a9,
                             CONCAT16((cStack_7aa < cStack_7ba) * cStack_7ba |
                                      (cStack_7aa >= cStack_7ba) * cStack_7aa,
                                      CONCAT15((cStack_7ab < cStack_7bb) * cStack_7bb |
                                               (cStack_7ab >= cStack_7bb) * cStack_7ab,
                                               CONCAT14((cStack_7ac < cStack_7bc) * cStack_7bc |
                                                        (cStack_7ac >= cStack_7bc) * cStack_7ac,
                                                        CONCAT13((cStack_7ad < cStack_7bd) *
                                                                 cStack_7bd |
                                                                 (cStack_7ad >= cStack_7bd) *
                                                                 cStack_7ad,
                                                                 CONCAT12((cStack_7ae < cStack_7be)
                                                                          * cStack_7be |
                                                                          (cStack_7ae >= cStack_7be)
                                                                          * cStack_7ae,
                                                                          CONCAT11((cStack_7af <
                                                                                   cStack_7bf) *
                                                                                   cStack_7bf |
                                                                                   (cStack_7af >=
                                                                                   cStack_7bf) *
                                                                                   cStack_7af,
                                                                                   (cStack_7b0 <
                                                                                   cStack_7c0) *
                                                                                   cStack_7c0 |
                                                                                   (cStack_7b0 >=
                                                                                   cStack_7c0) *
                                                                                   cStack_7b0)))))))
            ;
            cVar64 = -(local_7c8 < local_7b8);
            cVar65 = -(cStack_7c7 < cStack_7b7);
            cVar69 = -(cStack_7c6 < cStack_7b6);
            cVar70 = -(cStack_7c5 < cStack_7b5);
            cVar72 = -(cStack_7c4 < cStack_7b4);
            cVar73 = -(cStack_7c3 < cStack_7b3);
            cVar75 = -(cStack_7c2 < cStack_7b2);
            cVar76 = -(cStack_7c1 < cStack_7b1);
            cVar78 = -(cStack_7c0 < cStack_7b0);
            cVar79 = -(cStack_7bf < cStack_7af);
            cVar81 = -(cStack_7be < cStack_7ae);
            cVar82 = -(cStack_7bd < cStack_7ad);
            cVar84 = -(cStack_7bc < cStack_7ac);
            cVar85 = -(cStack_7bb < cStack_7ab);
            cVar87 = -(cStack_7ba < cStack_7aa);
            cVar88 = -(cStack_7b9 < cStack_7a9);
            auVar29[1] = cVar65;
            auVar29[0] = cVar64;
            auVar29[2] = cVar69;
            auVar29[3] = cVar70;
            auVar29[4] = cVar72;
            auVar29[5] = cVar73;
            auVar29[6] = cVar75;
            auVar29[7] = cVar76;
            auVar29[9] = cVar79;
            auVar29[8] = cVar78;
            auVar29[10] = cVar81;
            auVar29[0xb] = cVar82;
            auVar29[0xc] = cVar84;
            auVar29[0xd] = cVar85;
            auVar29[0xe] = cVar87;
            auVar29[0xf] = cVar88;
            auVar67 = pblendvb((undefined1  [16])alVar125,auVar114,auVar29);
            auVar28[1] = cVar65;
            auVar28[0] = cVar64;
            auVar28[2] = cVar69;
            auVar28[3] = cVar70;
            auVar28[4] = cVar72;
            auVar28[5] = cVar73;
            auVar28[6] = cVar75;
            auVar28[7] = cVar76;
            auVar28[9] = cVar79;
            auVar28[8] = cVar78;
            auVar28[10] = cVar81;
            auVar28[0xb] = cVar82;
            auVar28[0xc] = cVar84;
            auVar28[0xd] = cVar85;
            auVar28[0xe] = cVar87;
            auVar28[0xf] = cVar88;
            auVar119 = pblendvb((undefined1  [16])alVar126,auVar115,auVar28);
            auVar120._8_8_ = 0x101010101010101;
            auVar120._0_8_ = 0x101010101010101;
            auVar120 = paddsb((undefined1  [16])alVar127,auVar120);
            auVar117._8_8_ = 0x101010101010101;
            auVar117._0_8_ = 0x101010101010101;
            auVar117 = paddsb(auVar116,auVar117);
            auVar27[1] = cVar65;
            auVar27[0] = cVar64;
            auVar27[2] = cVar69;
            auVar27[3] = cVar70;
            auVar27[4] = cVar72;
            auVar27[5] = cVar73;
            auVar27[6] = cVar75;
            auVar27[7] = cVar76;
            auVar27[9] = cVar79;
            auVar27[8] = cVar78;
            auVar27[10] = cVar81;
            auVar27[0xb] = cVar82;
            auVar27[0xc] = cVar84;
            auVar27[0xd] = cVar85;
            auVar27[0xe] = cVar87;
            auVar27[0xf] = cVar88;
            auVar117 = pblendvb(auVar120,auVar117,auVar27);
            ptr[k][0] = vE_ext[1];
            ptr[k][1] = vE[0];
            vES[1] = auVar67._0_8_;
            vEM[0] = auVar67._8_8_;
            b[k][0] = vES[1];
            b[k][1] = vEM[0];
            vEL[1] = auVar119._0_8_;
            vES[0] = auVar119._8_8_;
            b_00[k][0] = vEL[1];
            b_00[k][1] = vES[0];
            vF[1] = auVar117._0_8_;
            vEL[0] = auVar117._8_8_;
            b_01[k][0] = vF[1];
            b_01[k][1] = vEL[0];
            auVar41._8_8_ = vF[0];
            auVar41._0_8_ = vF_ext[1];
            auVar40._8_8_ = uVar11;
            auVar40._0_8_ = uVar8;
            auVar67 = psubsb(auVar41,auVar40);
            local_7e8 = auVar67[0];
            cStack_7e7 = auVar67[1];
            cStack_7e6 = auVar67[2];
            cStack_7e5 = auVar67[3];
            cStack_7e4 = auVar67[4];
            cStack_7e3 = auVar67[5];
            cStack_7e2 = auVar67[6];
            cStack_7e1 = auVar67[7];
            cStack_7e0 = auVar67[8];
            cStack_7df = auVar67[9];
            cStack_7de = auVar67[10];
            cStack_7dd = auVar67[0xb];
            cStack_7dc = auVar67[0xc];
            cStack_7db = auVar67[0xd];
            cStack_7da = auVar67[0xe];
            cStack_7d9 = auVar67[0xf];
            vF_ext[1] = CONCAT17((cStack_7b1 < cStack_7e1) * cStack_7e1 |
                                 (cStack_7b1 >= cStack_7e1) * cStack_7b1,
                                 CONCAT16((cStack_7b2 < cStack_7e2) * cStack_7e2 |
                                          (cStack_7b2 >= cStack_7e2) * cStack_7b2,
                                          CONCAT15((cStack_7b3 < cStack_7e3) * cStack_7e3 |
                                                   (cStack_7b3 >= cStack_7e3) * cStack_7b3,
                                                   CONCAT14((cStack_7b4 < cStack_7e4) * cStack_7e4 |
                                                            (cStack_7b4 >= cStack_7e4) * cStack_7b4,
                                                            CONCAT13((cStack_7b5 < cStack_7e5) *
                                                                     cStack_7e5 |
                                                                     (cStack_7b5 >= cStack_7e5) *
                                                                     cStack_7b5,
                                                                     CONCAT12((cStack_7b6 <
                                                                              cStack_7e6) *
                                                                              cStack_7e6 |
                                                                              (cStack_7b6 >=
                                                                              cStack_7e6) *
                                                                              cStack_7b6,
                                                                              CONCAT11((cStack_7b7 <
                                                                                       cStack_7e7) *
                                                                                       cStack_7e7 |
                                                                                       (cStack_7b7
                                                                                       >= cStack_7e7
                                                                                       ) * 
                                                  cStack_7b7,
                                                  (local_7b8 < local_7e8) * local_7e8 |
                                                  (local_7b8 >= local_7e8) * local_7b8)))))));
            vF[0] = CONCAT17((cStack_7a9 < cStack_7d9) * cStack_7d9 |
                             (cStack_7a9 >= cStack_7d9) * cStack_7a9,
                             CONCAT16((cStack_7aa < cStack_7da) * cStack_7da |
                                      (cStack_7aa >= cStack_7da) * cStack_7aa,
                                      CONCAT15((cStack_7ab < cStack_7db) * cStack_7db |
                                               (cStack_7ab >= cStack_7db) * cStack_7ab,
                                               CONCAT14((cStack_7ac < cStack_7dc) * cStack_7dc |
                                                        (cStack_7ac >= cStack_7dc) * cStack_7ac,
                                                        CONCAT13((cStack_7ad < cStack_7dd) *
                                                                 cStack_7dd |
                                                                 (cStack_7ad >= cStack_7dd) *
                                                                 cStack_7ad,
                                                                 CONCAT12((cStack_7ae < cStack_7de)
                                                                          * cStack_7de |
                                                                          (cStack_7ae >= cStack_7de)
                                                                          * cStack_7ae,
                                                                          CONCAT11((cStack_7af <
                                                                                   cStack_7df) *
                                                                                   cStack_7df |
                                                                                   (cStack_7af >=
                                                                                   cStack_7df) *
                                                                                   cStack_7af,
                                                                                   (cStack_7b0 <
                                                                                   cStack_7e0) *
                                                                                   cStack_7e0 |
                                                                                   (cStack_7b0 >=
                                                                                   cStack_7e0) *
                                                                                   cStack_7b0)))))))
            ;
            cVar64 = -(local_7e8 < local_7b8);
            cVar65 = -(cStack_7e7 < cStack_7b7);
            cVar69 = -(cStack_7e6 < cStack_7b6);
            cVar70 = -(cStack_7e5 < cStack_7b5);
            cVar72 = -(cStack_7e4 < cStack_7b4);
            cVar73 = -(cStack_7e3 < cStack_7b3);
            cVar75 = -(cStack_7e2 < cStack_7b2);
            cVar76 = -(cStack_7e1 < cStack_7b1);
            cVar78 = -(cStack_7e0 < cStack_7b0);
            cVar79 = -(cStack_7df < cStack_7af);
            cVar81 = -(cStack_7de < cStack_7ae);
            cVar82 = -(cStack_7dd < cStack_7ad);
            cVar84 = -(cStack_7dc < cStack_7ac);
            cVar85 = -(cStack_7db < cStack_7ab);
            cVar87 = -(cStack_7da < cStack_7aa);
            cVar88 = -(cStack_7d9 < cStack_7a9);
            auVar26[1] = cVar65;
            auVar26[0] = cVar64;
            auVar26[2] = cVar69;
            auVar26[3] = cVar70;
            auVar26[4] = cVar72;
            auVar26[5] = cVar73;
            auVar26[6] = cVar75;
            auVar26[7] = cVar76;
            auVar26[9] = cVar79;
            auVar26[8] = cVar78;
            auVar26[10] = cVar81;
            auVar26[0xb] = cVar82;
            auVar26[0xc] = cVar84;
            auVar26[0xd] = cVar85;
            auVar26[0xe] = cVar87;
            auVar26[0xf] = cVar88;
            register0x00001240 = pblendvb(stack0xfffffffffffff128,auVar114,auVar26);
            auVar25[1] = cVar65;
            auVar25[0] = cVar64;
            auVar25[2] = cVar69;
            auVar25[3] = cVar70;
            auVar25[4] = cVar72;
            auVar25[5] = cVar73;
            auVar25[6] = cVar75;
            auVar25[7] = cVar76;
            auVar25[9] = cVar79;
            auVar25[8] = cVar78;
            auVar25[10] = cVar81;
            auVar25[0xb] = cVar82;
            auVar25[0xc] = cVar84;
            auVar25[0xd] = cVar85;
            auVar25[0xe] = cVar87;
            auVar25[0xf] = cVar88;
            register0x00001240 = pblendvb(stack0xfffffffffffff118,auVar115,auVar25);
            auVar119._8_8_ = 0x101010101010101;
            auVar119._0_8_ = 0x101010101010101;
            auVar119 = paddsb(stack0xfffffffffffff108,auVar119);
            auVar67._8_8_ = 0x101010101010101;
            auVar67._0_8_ = 0x101010101010101;
            auVar67 = paddsb(auVar116,auVar67);
            auVar115[1] = cVar65;
            auVar115[0] = cVar64;
            auVar115[2] = cVar69;
            auVar115[3] = cVar70;
            auVar115[4] = cVar72;
            auVar115[5] = cVar73;
            auVar115[6] = cVar75;
            auVar115[7] = cVar76;
            auVar115[9] = cVar79;
            auVar115[8] = cVar78;
            auVar115[10] = cVar81;
            auVar115[0xb] = cVar82;
            auVar115[0xc] = cVar84;
            auVar115[0xd] = cVar85;
            auVar115[0xe] = cVar87;
            auVar115[0xf] = cVar88;
            register0x00001240 = pblendvb(auVar119,auVar67,auVar115);
            vH_dag[1] = palVar54[k][0];
            vH[0] = palVar54[k][1];
            unique0x10005c06 = palVar52[k];
            unique0x10005c16 = palVar50[k];
            _vP = palVar48[k];
          }
          for (end_query = 0; end_query < 0x10; end_query = end_query + 1) {
            uVar66 = palVar54[iVar57 + -1][0];
            in_stack_ffffffffffffef98 = (ulong)(ptr_00[s1Len + 1] - open);
            if ((long)in_stack_ffffffffffffef98 < -0x80) {
              in_stack_ffffffffffffef98 = 0xffffffffffffff80;
            }
            vF[0] = vF[0] << 8 | (ulong)vF_ext[1] >> 0x38;
            vFM[0] = vFM[0] << 8 | (ulong)vFS[1] >> 0x38;
            vFS[1] = vFS[1] << 8;
            vFS[0] = vFS[0] << 8 | (ulong)vFL[1] >> 0x38;
            vFL[1] = vFL[1] << 8;
            vHp[0] = palVar54[iVar57 + -1][1] << 8 | uVar66 >> 0x38;
            tmp_6 = uVar66 << 8 | (ulong)(byte)ptr_00[s1Len];
            vF_ext[1] = vF_ext[1] << 8 | in_stack_ffffffffffffef98 & 0xff;
            vFL[0] = vFL[0] << 8 | (ulong)vH[1] >> 0x38;
            vH[1] = vH[1] << 8 | 1;
            for (k = 0; k < iVar57; k = k + 1) {
              auVar67 = paddsb((undefined1  [16])_tmp_6,
                               *(undefined1 (*) [16])
                                ((long)pvVar4 + (long)k * 0x10 + (long)iVar61 * 0x10));
              lVar15 = palVar53[k][0];
              lVar16 = palVar53[k][1];
              local_7f8 = (char)lVar15;
              cStack_7f7 = (char)((ulong)lVar15 >> 8);
              cStack_7f6 = (char)((ulong)lVar15 >> 0x10);
              cStack_7f5 = (char)((ulong)lVar15 >> 0x18);
              cStack_7f4 = (char)((ulong)lVar15 >> 0x20);
              cStack_7f3 = (char)((ulong)lVar15 >> 0x28);
              cStack_7f2 = (char)((ulong)lVar15 >> 0x30);
              cStack_7f1 = (char)((ulong)lVar15 >> 0x38);
              cStack_7f0 = (char)lVar16;
              cStack_7ef = (char)((ulong)lVar16 >> 8);
              cStack_7ee = (char)((ulong)lVar16 >> 0x10);
              cStack_7ed = (char)((ulong)lVar16 >> 0x18);
              cStack_7ec = (char)((ulong)lVar16 >> 0x20);
              cStack_7eb = (char)((ulong)lVar16 >> 0x28);
              cStack_7ea = (char)((ulong)lVar16 >> 0x30);
              cStack_7e9 = (char)((ulong)lVar16 >> 0x38);
              local_808 = (byte)vF_ext[1];
              bStack_807 = (byte)((ulong)vF_ext[1] >> 8);
              bStack_806 = (byte)((ulong)vF_ext[1] >> 0x10);
              bStack_805 = (byte)((ulong)vF_ext[1] >> 0x18);
              bStack_804 = (byte)((ulong)vF_ext[1] >> 0x20);
              bStack_803 = (byte)((ulong)vF_ext[1] >> 0x28);
              bStack_802 = (byte)((ulong)vF_ext[1] >> 0x30);
              bStack_801 = (byte)((ulong)vF_ext[1] >> 0x38);
              bStack_800 = (byte)vF[0];
              bStack_7ff = (byte)((ulong)vF[0] >> 8);
              bStack_7fe = (byte)((ulong)vF[0] >> 0x10);
              bStack_7fd = (byte)((ulong)vF[0] >> 0x18);
              bStack_7fc = (byte)((ulong)vF[0] >> 0x20);
              bStack_7fb = (byte)((ulong)vF[0] >> 0x28);
              bStack_7fa = (byte)((ulong)vF[0] >> 0x30);
              bStack_7f9 = (byte)((ulong)vF[0] >> 0x38);
              bVar63 = (local_7f8 < (char)local_808) * local_808 |
                       (local_7f8 >= (char)local_808) * local_7f8;
              bVar68 = (cStack_7f7 < (char)bStack_807) * bStack_807 |
                       (cStack_7f7 >= (char)bStack_807) * cStack_7f7;
              bVar71 = (cStack_7f6 < (char)bStack_806) * bStack_806 |
                       (cStack_7f6 >= (char)bStack_806) * cStack_7f6;
              bVar74 = (cStack_7f5 < (char)bStack_805) * bStack_805 |
                       (cStack_7f5 >= (char)bStack_805) * cStack_7f5;
              bVar77 = (cStack_7f4 < (char)bStack_804) * bStack_804 |
                       (cStack_7f4 >= (char)bStack_804) * cStack_7f4;
              bVar80 = (cStack_7f3 < (char)bStack_803) * bStack_803 |
                       (cStack_7f3 >= (char)bStack_803) * cStack_7f3;
              bVar83 = (cStack_7f2 < (char)bStack_802) * bStack_802 |
                       (cStack_7f2 >= (char)bStack_802) * cStack_7f2;
              bVar86 = (cStack_7f1 < (char)bStack_801) * bStack_801 |
                       (cStack_7f1 >= (char)bStack_801) * cStack_7f1;
              bVar89 = (cStack_7f0 < (char)bStack_800) * bStack_800 |
                       (cStack_7f0 >= (char)bStack_800) * cStack_7f0;
              bVar93 = (cStack_7ef < (char)bStack_7ff) * bStack_7ff |
                       (cStack_7ef >= (char)bStack_7ff) * cStack_7ef;
              bVar96 = (cStack_7ee < (char)bStack_7fe) * bStack_7fe |
                       (cStack_7ee >= (char)bStack_7fe) * cStack_7ee;
              bVar99 = (cStack_7ed < (char)bStack_7fd) * bStack_7fd |
                       (cStack_7ed >= (char)bStack_7fd) * cStack_7ed;
              bVar102 = (cStack_7ec < (char)bStack_7fc) * bStack_7fc |
                        (cStack_7ec >= (char)bStack_7fc) * cStack_7ec;
              bVar105 = (cStack_7eb < (char)bStack_7fb) * bStack_7fb |
                        (cStack_7eb >= (char)bStack_7fb) * cStack_7eb;
              bVar108 = (cStack_7ea < (char)bStack_7fa) * bStack_7fa |
                        (cStack_7ea >= (char)bStack_7fa) * cStack_7ea;
              bVar111 = (cStack_7e9 < (char)bStack_7f9) * bStack_7f9 |
                        (cStack_7e9 >= (char)bStack_7f9) * cStack_7e9;
              vH_dag[1]._0_2_ = CONCAT11(bVar68,bVar63);
              vH_dag[1]._0_3_ = CONCAT12(bVar71,(undefined2)vH_dag[1]);
              vH_dag[1]._0_4_ = CONCAT13(bVar74,(undefined3)vH_dag[1]);
              vH_dag[1]._0_5_ = CONCAT14(bVar77,(undefined4)vH_dag[1]);
              vH_dag[1]._0_6_ = CONCAT15(bVar80,(undefined5)vH_dag[1]);
              vH_dag[1]._0_7_ = CONCAT16(bVar83,(undefined6)vH_dag[1]);
              vH_dag[1] = CONCAT17(bVar86,(undefined7)vH_dag[1]);
              vH[0]._0_2_ = CONCAT11(bVar93,bVar89);
              vH[0]._0_3_ = CONCAT12(bVar96,(undefined2)vH[0]);
              vH[0]._0_4_ = CONCAT13(bVar99,(undefined3)vH[0]);
              vH[0]._0_5_ = CONCAT14(bVar102,(undefined4)vH[0]);
              vH[0]._0_6_ = CONCAT15(bVar105,(undefined5)vH[0]);
              vH[0]._0_7_ = CONCAT16(bVar108,(undefined6)vH[0]);
              vH[0] = CONCAT17(bVar111,(undefined7)vH[0]);
              palVar53[k][0] = vH_dag[1];
              palVar53[k][1] = vH[0];
              local_6a8 = auVar67[0];
              bStack_6a7 = auVar67[1];
              bStack_6a6 = auVar67[2];
              bStack_6a5 = auVar67[3];
              bStack_6a4 = auVar67[4];
              bStack_6a3 = auVar67[5];
              bStack_6a2 = auVar67[6];
              bStack_6a1 = auVar67[7];
              bStack_6a0 = auVar67[8];
              bStack_69f = auVar67[9];
              bStack_69e = auVar67[10];
              bStack_69d = auVar67[0xb];
              bStack_69c = auVar67[0xc];
              bStack_69b = auVar67[0xd];
              bStack_69a = auVar67[0xe];
              bStack_699 = auVar67[0xf];
              uVar66 = ~CONCAT17(-(bVar86 == bStack_6a1),
                                 CONCAT16(-(bVar83 == bStack_6a2),
                                          CONCAT15(-(bVar80 == bStack_6a3),
                                                   CONCAT14(-(bVar77 == bStack_6a4),
                                                            CONCAT13(-(bVar74 == bStack_6a5),
                                                                     CONCAT12(-(bVar71 == bStack_6a6
                                                                               ),CONCAT11(-(bVar68 
                                                  == bStack_6a7),-(bVar63 == local_6a8)))))))) &
                       CONCAT17(-(bVar86 == bStack_801),
                                CONCAT16(-(bVar83 == bStack_802),
                                         CONCAT15(-(bVar80 == bStack_803),
                                                  CONCAT14(-(bVar77 == bStack_804),
                                                           CONCAT13(-(bVar74 == bStack_805),
                                                                    CONCAT12(-(bVar71 == bStack_806)
                                                                             ,CONCAT11(-(bVar68 ==
                                                                                        bStack_807),
                                                                                       -(bVar63 ==
                                                                                        local_808)))
                                                                   )))));
              uVar92 = ~CONCAT17(-(bVar111 == bStack_699),
                                 CONCAT16(-(bVar108 == bStack_69a),
                                          CONCAT15(-(bVar105 == bStack_69b),
                                                   CONCAT14(-(bVar102 == bStack_69c),
                                                            CONCAT13(-(bVar99 == bStack_69d),
                                                                     CONCAT12(-(bVar96 == bStack_69e
                                                                               ),CONCAT11(-(bVar93 
                                                  == bStack_69f),-(bVar89 == bStack_6a0)))))))) &
                       CONCAT17(-(bVar111 == bStack_7f9),
                                CONCAT16(-(bVar108 == bStack_7fa),
                                         CONCAT15(-(bVar105 == bStack_7fb),
                                                  CONCAT14(-(bVar102 == bStack_7fc),
                                                           CONCAT13(-(bVar99 == bStack_7fd),
                                                                    CONCAT12(-(bVar96 == bStack_7fe)
                                                                             ,CONCAT11(-(bVar93 ==
                                                                                        bStack_7ff),
                                                                                       -(bVar89 ==
                                                                                        bStack_800))
                                                                            ))))));
              auVar24._8_8_ = uVar92;
              auVar24._0_8_ = uVar66;
              auVar117 = pblendvb((undefined1  [16])palVar51[k],stack0xfffffffffffff128,auVar24);
              vHS[1] = auVar117._0_8_;
              vHM[0] = auVar117._8_8_;
              palVar51[k][0] = vHS[1];
              palVar51[k][1] = vHM[0];
              auVar23._8_8_ = uVar92;
              auVar23._0_8_ = uVar66;
              auVar120 = pblendvb((undefined1  [16])palVar49[k],stack0xfffffffffffff118,auVar23);
              vHL[1] = auVar120._0_8_;
              vHS[0] = auVar120._8_8_;
              palVar49[k][0] = vHL[1];
              palVar49[k][1] = vHS[0];
              auVar22._8_8_ = uVar92;
              auVar22._0_8_ = uVar66;
              auVar116 = pblendvb((undefined1  [16])palVar47[k],stack0xfffffffffffff108,auVar22);
              vP = auVar116._0_8_;
              vHL[0] = auVar116._8_8_;
              palVar47[k][0] = (longlong)vP;
              palVar47[k][1] = vHL[0];
              local_2d8 = (char)vSaturationCheckMax[1];
              cStack_2d7 = (char)((ulong)vSaturationCheckMax[1] >> 8);
              cStack_2d6 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
              cStack_2d5 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
              cStack_2d4 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
              cStack_2d3 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
              cStack_2d2 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
              cStack_2d1 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
              cStack_2d0 = (char)vSaturationCheckMin[0];
              cStack_2cf = (char)((ulong)vSaturationCheckMin[0] >> 8);
              cStack_2ce = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
              cStack_2cd = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
              cStack_2cc = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
              cStack_2cb = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
              cStack_2ca = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
              cStack_2c9 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
              vSaturationCheckMax[1]._0_2_ =
                   CONCAT11(((char)bVar68 < cStack_2d7) * bVar68 |
                            ((char)bVar68 >= cStack_2d7) * cStack_2d7,
                            ((char)bVar63 < local_2d8) * bVar63 |
                            ((char)bVar63 >= local_2d8) * local_2d8);
              vSaturationCheckMax[1]._0_3_ =
                   CONCAT12(((char)bVar71 < cStack_2d6) * bVar71 |
                            ((char)bVar71 >= cStack_2d6) * cStack_2d6,
                            (undefined2)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_4_ =
                   CONCAT13(((char)bVar74 < cStack_2d5) * bVar74 |
                            ((char)bVar74 >= cStack_2d5) * cStack_2d5,
                            (undefined3)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_5_ =
                   CONCAT14(((char)bVar77 < cStack_2d4) * bVar77 |
                            ((char)bVar77 >= cStack_2d4) * cStack_2d4,
                            (undefined4)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_6_ =
                   CONCAT15(((char)bVar80 < cStack_2d3) * bVar80 |
                            ((char)bVar80 >= cStack_2d3) * cStack_2d3,
                            (undefined5)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_7_ =
                   CONCAT16(((char)bVar83 < cStack_2d2) * bVar83 |
                            ((char)bVar83 >= cStack_2d2) * cStack_2d2,
                            (undefined6)vSaturationCheckMax[1]);
              vSaturationCheckMax[1] =
                   CONCAT17(((char)bVar86 < cStack_2d1) * bVar86 |
                            ((char)bVar86 >= cStack_2d1) * cStack_2d1,
                            (undefined7)vSaturationCheckMax[1]);
              vSaturationCheckMin[0]._0_2_ =
                   CONCAT11(((char)bVar93 < cStack_2cf) * bVar93 |
                            ((char)bVar93 >= cStack_2cf) * cStack_2cf,
                            ((char)bVar89 < cStack_2d0) * bVar89 |
                            ((char)bVar89 >= cStack_2d0) * cStack_2d0);
              vSaturationCheckMin[0]._0_3_ =
                   CONCAT12(((char)bVar96 < cStack_2ce) * bVar96 |
                            ((char)bVar96 >= cStack_2ce) * cStack_2ce,
                            (undefined2)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_4_ =
                   CONCAT13(((char)bVar99 < cStack_2cd) * bVar99 |
                            ((char)bVar99 >= cStack_2cd) * cStack_2cd,
                            (undefined3)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_5_ =
                   CONCAT14(((char)bVar102 < cStack_2cc) * bVar102 |
                            ((char)bVar102 >= cStack_2cc) * cStack_2cc,
                            (undefined4)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_6_ =
                   CONCAT15(((char)bVar105 < cStack_2cb) * bVar105 |
                            ((char)bVar105 >= cStack_2cb) * cStack_2cb,
                            (undefined5)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_7_ =
                   CONCAT16(((char)bVar108 < cStack_2ca) * bVar108 |
                            ((char)bVar108 >= cStack_2ca) * cStack_2ca,
                            (undefined6)vSaturationCheckMin[0]);
              vSaturationCheckMin[0] =
                   CONCAT17(((char)bVar111 < cStack_2c9) * bVar111 |
                            ((char)bVar111 >= cStack_2c9) * cStack_2c9,
                            (undefined7)vSaturationCheckMin[0]);
              local_818 = (char)result;
              cStack_817 = (char)((ulong)result >> 8);
              cStack_816 = (char)((ulong)result >> 0x10);
              cStack_815 = (char)((ulong)result >> 0x18);
              cStack_814 = (char)((ulong)result >> 0x20);
              cStack_813 = (char)((ulong)result >> 0x28);
              cStack_812 = (char)((ulong)result >> 0x30);
              cStack_811 = (char)((ulong)result >> 0x38);
              cStack_810 = (char)vSaturationCheckMax[0];
              cStack_80f = (char)((ulong)vSaturationCheckMax[0] >> 8);
              cStack_80e = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
              cStack_80d = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
              cStack_80c = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
              cStack_80b = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
              cStack_80a = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
              cStack_809 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
              bVar63 = (local_818 < (char)bVar63) * bVar63 | (local_818 >= (char)bVar63) * local_818
              ;
              bVar68 = (cStack_817 < (char)bVar68) * bVar68 |
                       (cStack_817 >= (char)bVar68) * cStack_817;
              bVar71 = (cStack_816 < (char)bVar71) * bVar71 |
                       (cStack_816 >= (char)bVar71) * cStack_816;
              bVar74 = (cStack_815 < (char)bVar74) * bVar74 |
                       (cStack_815 >= (char)bVar74) * cStack_815;
              bVar77 = (cStack_814 < (char)bVar77) * bVar77 |
                       (cStack_814 >= (char)bVar77) * cStack_814;
              bVar80 = (cStack_813 < (char)bVar80) * bVar80 |
                       (cStack_813 >= (char)bVar80) * cStack_813;
              bVar83 = (cStack_812 < (char)bVar83) * bVar83 |
                       (cStack_812 >= (char)bVar83) * cStack_812;
              bVar86 = (cStack_811 < (char)bVar86) * bVar86 |
                       (cStack_811 >= (char)bVar86) * cStack_811;
              bVar89 = (cStack_810 < (char)bVar89) * bVar89 |
                       (cStack_810 >= (char)bVar89) * cStack_810;
              bVar93 = (cStack_80f < (char)bVar93) * bVar93 |
                       (cStack_80f >= (char)bVar93) * cStack_80f;
              bVar96 = (cStack_80e < (char)bVar96) * bVar96 |
                       (cStack_80e >= (char)bVar96) * cStack_80e;
              bVar99 = (cStack_80d < (char)bVar99) * bVar99 |
                       (cStack_80d >= (char)bVar99) * cStack_80d;
              bVar102 = (cStack_80c < (char)bVar102) * bVar102 |
                        (cStack_80c >= (char)bVar102) * cStack_80c;
              bVar105 = (cStack_80b < (char)bVar105) * bVar105 |
                        (cStack_80b >= (char)bVar105) * cStack_80b;
              bVar108 = (cStack_80a < (char)bVar108) * bVar108 |
                        (cStack_80a >= (char)bVar108) * cStack_80a;
              bVar111 = (cStack_809 < (char)bVar111) * bVar111 |
                        (cStack_809 >= (char)bVar111) * cStack_809;
              local_848 = auVar117[0];
              cStack_847 = auVar117[1];
              cStack_846 = auVar117[2];
              cStack_845 = auVar117[3];
              cStack_844 = auVar117[4];
              cStack_843 = auVar117[5];
              cStack_842 = auVar117[6];
              cStack_841 = auVar117[7];
              cStack_840 = auVar117[8];
              cStack_83f = auVar117[9];
              cStack_83e = auVar117[10];
              cStack_83d = auVar117[0xb];
              cStack_83c = auVar117[0xc];
              cStack_83b = auVar117[0xd];
              cStack_83a = auVar117[0xe];
              cStack_839 = auVar117[0xf];
              bVar63 = ((char)bVar63 < local_848) * local_848 | ((char)bVar63 >= local_848) * bVar63
              ;
              bVar68 = ((char)bVar68 < cStack_847) * cStack_847 |
                       ((char)bVar68 >= cStack_847) * bVar68;
              bVar71 = ((char)bVar71 < cStack_846) * cStack_846 |
                       ((char)bVar71 >= cStack_846) * bVar71;
              bVar74 = ((char)bVar74 < cStack_845) * cStack_845 |
                       ((char)bVar74 >= cStack_845) * bVar74;
              bVar77 = ((char)bVar77 < cStack_844) * cStack_844 |
                       ((char)bVar77 >= cStack_844) * bVar77;
              bVar80 = ((char)bVar80 < cStack_843) * cStack_843 |
                       ((char)bVar80 >= cStack_843) * bVar80;
              bVar83 = ((char)bVar83 < cStack_842) * cStack_842 |
                       ((char)bVar83 >= cStack_842) * bVar83;
              bVar86 = ((char)bVar86 < cStack_841) * cStack_841 |
                       ((char)bVar86 >= cStack_841) * bVar86;
              bVar89 = ((char)bVar89 < cStack_840) * cStack_840 |
                       ((char)bVar89 >= cStack_840) * bVar89;
              bVar93 = ((char)bVar93 < cStack_83f) * cStack_83f |
                       ((char)bVar93 >= cStack_83f) * bVar93;
              bVar96 = ((char)bVar96 < cStack_83e) * cStack_83e |
                       ((char)bVar96 >= cStack_83e) * bVar96;
              bVar99 = ((char)bVar99 < cStack_83d) * cStack_83d |
                       ((char)bVar99 >= cStack_83d) * bVar99;
              bVar102 = ((char)bVar102 < cStack_83c) * cStack_83c |
                        ((char)bVar102 >= cStack_83c) * bVar102;
              bVar105 = ((char)bVar105 < cStack_83b) * cStack_83b |
                        ((char)bVar105 >= cStack_83b) * bVar105;
              bVar108 = ((char)bVar108 < cStack_83a) * cStack_83a |
                        ((char)bVar108 >= cStack_83a) * bVar108;
              bVar111 = ((char)bVar111 < cStack_839) * cStack_839 |
                        ((char)bVar111 >= cStack_839) * bVar111;
              local_868 = auVar120[0];
              cStack_867 = auVar120[1];
              cStack_866 = auVar120[2];
              cStack_865 = auVar120[3];
              cStack_864 = auVar120[4];
              cStack_863 = auVar120[5];
              cStack_862 = auVar120[6];
              cStack_861 = auVar120[7];
              cStack_860 = auVar120[8];
              cStack_85f = auVar120[9];
              cStack_85e = auVar120[10];
              cStack_85d = auVar120[0xb];
              cStack_85c = auVar120[0xc];
              cStack_85b = auVar120[0xd];
              cStack_85a = auVar120[0xe];
              cStack_859 = auVar120[0xf];
              bVar63 = ((char)bVar63 < local_868) * local_868 | ((char)bVar63 >= local_868) * bVar63
              ;
              bVar68 = ((char)bVar68 < cStack_867) * cStack_867 |
                       ((char)bVar68 >= cStack_867) * bVar68;
              bVar71 = ((char)bVar71 < cStack_866) * cStack_866 |
                       ((char)bVar71 >= cStack_866) * bVar71;
              bVar74 = ((char)bVar74 < cStack_865) * cStack_865 |
                       ((char)bVar74 >= cStack_865) * bVar74;
              bVar77 = ((char)bVar77 < cStack_864) * cStack_864 |
                       ((char)bVar77 >= cStack_864) * bVar77;
              bVar80 = ((char)bVar80 < cStack_863) * cStack_863 |
                       ((char)bVar80 >= cStack_863) * bVar80;
              bVar83 = ((char)bVar83 < cStack_862) * cStack_862 |
                       ((char)bVar83 >= cStack_862) * bVar83;
              bVar86 = ((char)bVar86 < cStack_861) * cStack_861 |
                       ((char)bVar86 >= cStack_861) * bVar86;
              bVar89 = ((char)bVar89 < cStack_860) * cStack_860 |
                       ((char)bVar89 >= cStack_860) * bVar89;
              bVar93 = ((char)bVar93 < cStack_85f) * cStack_85f |
                       ((char)bVar93 >= cStack_85f) * bVar93;
              bVar96 = ((char)bVar96 < cStack_85e) * cStack_85e |
                       ((char)bVar96 >= cStack_85e) * bVar96;
              bVar99 = ((char)bVar99 < cStack_85d) * cStack_85d |
                       ((char)bVar99 >= cStack_85d) * bVar99;
              bVar102 = ((char)bVar102 < cStack_85c) * cStack_85c |
                        ((char)bVar102 >= cStack_85c) * bVar102;
              bVar105 = ((char)bVar105 < cStack_85b) * cStack_85b |
                        ((char)bVar105 >= cStack_85b) * bVar105;
              bVar108 = ((char)bVar108 < cStack_85a) * cStack_85a |
                        ((char)bVar108 >= cStack_85a) * bVar108;
              bVar111 = ((char)bVar111 < cStack_859) * cStack_859 |
                        ((char)bVar111 >= cStack_859) * bVar111;
              local_888 = auVar116[0];
              cStack_887 = auVar116[1];
              cStack_886 = auVar116[2];
              cStack_885 = auVar116[3];
              cStack_884 = auVar116[4];
              cStack_883 = auVar116[5];
              cStack_882 = auVar116[6];
              cStack_881 = auVar116[7];
              cStack_880 = auVar116[8];
              cStack_87f = auVar116[9];
              cStack_87e = auVar116[10];
              cStack_87d = auVar116[0xb];
              cStack_87c = auVar116[0xc];
              cStack_87b = auVar116[0xd];
              cStack_87a = auVar116[0xe];
              cStack_879 = auVar116[0xf];
              result._0_2_ = CONCAT11(((char)bVar68 < cStack_887) * cStack_887 |
                                      ((char)bVar68 >= cStack_887) * bVar68,
                                      ((char)bVar63 < local_888) * local_888 |
                                      ((char)bVar63 >= local_888) * bVar63);
              result._0_3_ = CONCAT12(((char)bVar71 < cStack_886) * cStack_886 |
                                      ((char)bVar71 >= cStack_886) * bVar71,result._0_2_);
              result._0_4_ = CONCAT13(((char)bVar74 < cStack_885) * cStack_885 |
                                      ((char)bVar74 >= cStack_885) * bVar74,result._0_3_);
              result._0_5_ = CONCAT14(((char)bVar77 < cStack_884) * cStack_884 |
                                      ((char)bVar77 >= cStack_884) * bVar77,result._0_4_);
              result._0_6_ = CONCAT15(((char)bVar80 < cStack_883) * cStack_883 |
                                      ((char)bVar80 >= cStack_883) * bVar80,result._0_5_);
              result._0_7_ = CONCAT16(((char)bVar83 < cStack_882) * cStack_882 |
                                      ((char)bVar83 >= cStack_882) * bVar83,result._0_6_);
              result = (parasail_result_t *)
                       CONCAT17(((char)bVar86 < cStack_881) * cStack_881 |
                                ((char)bVar86 >= cStack_881) * bVar86,result._0_7_);
              vSaturationCheckMax[0]._0_2_ =
                   CONCAT11(((char)bVar93 < cStack_87f) * cStack_87f |
                            ((char)bVar93 >= cStack_87f) * bVar93,
                            ((char)bVar89 < cStack_880) * cStack_880 |
                            ((char)bVar89 >= cStack_880) * bVar89);
              vSaturationCheckMax[0]._0_3_ =
                   CONCAT12(((char)bVar96 < cStack_87e) * cStack_87e |
                            ((char)bVar96 >= cStack_87e) * bVar96,(undefined2)vSaturationCheckMax[0]
                           );
              vSaturationCheckMax[0]._0_4_ =
                   CONCAT13(((char)bVar99 < cStack_87d) * cStack_87d |
                            ((char)bVar99 >= cStack_87d) * bVar99,(undefined3)vSaturationCheckMax[0]
                           );
              vSaturationCheckMax[0]._0_5_ =
                   CONCAT14(((char)bVar102 < cStack_87c) * cStack_87c |
                            ((char)bVar102 >= cStack_87c) * bVar102,
                            (undefined4)vSaturationCheckMax[0]);
              vSaturationCheckMax[0]._0_6_ =
                   CONCAT15(((char)bVar105 < cStack_87b) * cStack_87b |
                            ((char)bVar105 >= cStack_87b) * bVar105,
                            (undefined5)vSaturationCheckMax[0]);
              vSaturationCheckMax[0]._0_7_ =
                   CONCAT16(((char)bVar108 < cStack_87a) * cStack_87a |
                            ((char)bVar108 >= cStack_87a) * bVar108,
                            (undefined6)vSaturationCheckMax[0]);
              vSaturationCheckMax[0] =
                   CONCAT17(((char)bVar111 < cStack_879) * cStack_879 |
                            ((char)bVar111 >= cStack_879) * bVar111,
                            (undefined7)vSaturationCheckMax[0]);
              alVar127[0] = (ulong)(uint)k;
              alVar127[1]._0_4_ = iVar57;
              alVar127[1]._4_4_ = 0;
              arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                              &_segNum->matrix)->trace->trace_del_table + 8),
                              alVar127,s1Len,s2Len,in_R9D,(int32_t)in_stack_ffffffffffffef98);
              vH_04[0] = (ulong)(uint)k;
              vH_04[1]._0_4_ = iVar57;
              vH_04[1]._4_4_ = 0;
              arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                              &_segNum->matrix)->trace->trace_del_table + 0x10),
                              vH_04,s1Len,s2Len,in_R9D,(int32_t)in_stack_ffffffffffffef98);
              vH_05[0] = (ulong)(uint)k;
              vH_05[1]._0_4_ = iVar57;
              vH_05[1]._4_4_ = 0;
              arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                              &_segNum->matrix)->trace->trace_del_table + 0x18),
                              vH_05,s1Len,s2Len,in_R9D,(int32_t)in_stack_ffffffffffffef98);
              vH_06[0] = (ulong)(uint)k;
              vH_06[1]._0_4_ = iVar57;
              vH_06[1]._4_4_ = 0;
              arr_store_si128(*((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                               trace->trace_del_table,vH_06,s1Len,s2Len,in_R9D,
                              (int32_t)in_stack_ffffffffffffef98);
              auVar39._8_8_ = vH[0];
              auVar39._0_8_ = vH_dag[1];
              auVar38._8_8_ = uVar10;
              auVar38._0_8_ = uVar7;
              auVar67 = psubsb(auVar39,auVar38);
              auVar37._8_8_ = vF[0];
              auVar37._0_8_ = vF_ext[1];
              auVar36._8_8_ = uVar11;
              auVar36._0_8_ = uVar8;
              auVar119 = psubsb(auVar37,auVar36);
              vFM[1] = auVar119._0_8_;
              vF_ext[0] = auVar119._8_8_;
              local_1b8 = auVar119[0];
              cStack_1b7 = auVar119[1];
              cStack_1b6 = auVar119[2];
              cStack_1b5 = auVar119[3];
              cStack_1b4 = auVar119[4];
              cStack_1b3 = auVar119[5];
              cStack_1b2 = auVar119[6];
              cStack_1b1 = auVar119[7];
              cStack_1b0 = auVar119[8];
              cStack_1af = auVar119[9];
              cStack_1ae = auVar119[10];
              cStack_1ad = auVar119[0xb];
              cStack_1ac = auVar119[0xc];
              cStack_1ab = auVar119[0xd];
              cStack_1aa = auVar119[0xe];
              cStack_1a9 = auVar119[0xf];
              local_1c8 = auVar67[0];
              cStack_1c7 = auVar67[1];
              cStack_1c6 = auVar67[2];
              cStack_1c5 = auVar67[3];
              cStack_1c4 = auVar67[4];
              cStack_1c3 = auVar67[5];
              cStack_1c2 = auVar67[6];
              cStack_1c1 = auVar67[7];
              cStack_1c0 = auVar67[8];
              cStack_1bf = auVar67[9];
              cStack_1be = auVar67[10];
              cStack_1bd = auVar67[0xb];
              cStack_1bc = auVar67[0xc];
              cStack_1bb = auVar67[0xd];
              cStack_1ba = auVar67[0xe];
              cStack_1b9 = auVar67[0xf];
              auVar118._0_8_ =
                   CONCAT17(-(cStack_1c1 < cStack_1b1),
                            CONCAT16(-(cStack_1c2 < cStack_1b2),
                                     CONCAT15(-(cStack_1c3 < cStack_1b3),
                                              CONCAT14(-(cStack_1c4 < cStack_1b4),
                                                       CONCAT13(-(cStack_1c5 < cStack_1b5),
                                                                CONCAT12(-(cStack_1c6 < cStack_1b6),
                                                                         CONCAT11(-(cStack_1c7 <
                                                                                   cStack_1b7),
                                                                                  -(local_1c8 <
                                                                                   local_1b8))))))))
              ;
              auVar118[8] = -(cStack_1c0 < cStack_1b0);
              auVar118[9] = -(cStack_1bf < cStack_1af);
              auVar118[10] = -(cStack_1be < cStack_1ae);
              auVar118[0xb] = -(cStack_1bd < cStack_1ad);
              auVar118[0xc] = -(cStack_1bc < cStack_1ac);
              auVar118[0xd] = -(cStack_1bb < cStack_1ab);
              auVar118[0xe] = -(cStack_1ba < cStack_1aa);
              auVar118[0xf] = -(cStack_1b9 < cStack_1a9);
              uStack_f0 = auVar118._8_8_;
              uStack_f0 = uStack_f0 |
                          CONCAT17(-(cStack_1a9 == cStack_1b9),
                                   CONCAT16(-(cStack_1aa == cStack_1ba),
                                            CONCAT15(-(cStack_1ab == cStack_1bb),
                                                     CONCAT14(-(cStack_1ac == cStack_1bc),
                                                              CONCAT13(-(cStack_1ad == cStack_1bd),
                                                                       CONCAT12(-(cStack_1ae ==
                                                                                 cStack_1be),
                                                                                CONCAT11(-(
                                                  cStack_1af == cStack_1bf),
                                                  -(cStack_1b0 == cStack_1c0))))))));
              auVar46._8_8_ = uStack_f0;
              auVar46._0_8_ =
                   auVar118._0_8_ |
                   CONCAT17(-(cStack_1b1 == cStack_1c1),
                            CONCAT16(-(cStack_1b2 == cStack_1c2),
                                     CONCAT15(-(cStack_1b3 == cStack_1c3),
                                              CONCAT14(-(cStack_1b4 == cStack_1c4),
                                                       CONCAT13(-(cStack_1b5 == cStack_1c5),
                                                                CONCAT12(-(cStack_1b6 == cStack_1c6)
                                                                         ,CONCAT11(-(cStack_1b7 ==
                                                                                    cStack_1c7),
                                                                                   -(local_1b8 ==
                                                                                    local_1c8)))))))
                           );
              if ((((((((((((((((auVar46 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar46 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar46 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar46 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar46 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar46 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar46 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar46 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (uStack_f0 >> 7 & 1) == 0) && (uStack_f0 >> 0xf & 1) == 0) &&
                      (uStack_f0 >> 0x17 & 1) == 0) && (uStack_f0 >> 0x1f & 1) == 0) &&
                    (uStack_f0 >> 0x27 & 1) == 0) && (uStack_f0 >> 0x2f & 1) == 0) &&
                  (uStack_f0 >> 0x37 & 1) == 0) && -1 < (long)uStack_f0) goto LAB_00a23ab7;
              vF_ext[1] = vFM[1];
              vF[0] = vF_ext[0];
              vH_1[1] = CONCAT17(-(cStack_1b1 < cStack_1c1),
                                 CONCAT16(-(cStack_1b2 < cStack_1c2),
                                          CONCAT15(-(cStack_1b3 < cStack_1c3),
                                                   CONCAT14(-(cStack_1b4 < cStack_1c4),
                                                            CONCAT13(-(cStack_1b5 < cStack_1c5),
                                                                     CONCAT12(-(cStack_1b6 <
                                                                               cStack_1c6),
                                                                              CONCAT11(-(cStack_1b7
                                                                                        < cStack_1c7
                                                                                        ),-(
                                                  local_1b8 < local_1c8))))))));
              cond[0] = CONCAT17(-(cStack_1a9 < cStack_1b9),
                                 CONCAT16(-(cStack_1aa < cStack_1ba),
                                          CONCAT15(-(cStack_1ab < cStack_1bb),
                                                   CONCAT14(-(cStack_1ac < cStack_1bc),
                                                            CONCAT13(-(cStack_1ad < cStack_1bd),
                                                                     CONCAT12(-(cStack_1ae <
                                                                               cStack_1be),
                                                                              CONCAT11(-(cStack_1af
                                                                                        < cStack_1bf
                                                                                        ),-(
                                                  cStack_1b0 < cStack_1c0))))))));
              auVar21._8_8_ = cond[0];
              auVar21._0_8_ = vH_1[1];
              register0x00001240 = pblendvb(stack0xfffffffffffff128,auVar117,auVar21);
              auVar20._8_8_ = cond[0];
              auVar20._0_8_ = vH_1[1];
              register0x00001240 = pblendvb(stack0xfffffffffffff118,auVar120,auVar20);
              auVar18._8_8_ = 0x101010101010101;
              auVar18._0_8_ = 0x101010101010101;
              auVar119 = paddsb(stack0xfffffffffffff108,auVar18);
              auVar17._8_8_ = 0x101010101010101;
              auVar17._0_8_ = 0x101010101010101;
              auVar67 = paddsb(auVar116,auVar17);
              auVar19._8_8_ = cond[0];
              auVar19._0_8_ = vH_1[1];
              register0x00001240 = pblendvb(auVar119,auVar67,auVar19);
              _tmp_6 = palVar54[k];
            }
          }
LAB_00a23ab7:
        }
        vH_1[0] = pvHLoad[iVar62][1];
        vHM_1[0] = pvHMLoad[iVar62][1];
        vHS_1[0] = pvHSLoad[iVar62][1];
        vHL_1[0] = pvHLLoad[iVar62][1];
        uStack_1038 = pvHLLoad[iVar62][0];
        vHL_1[1] = pvHSLoad[iVar62][0];
        vHS_1[1] = pvHMLoad[iVar62][0];
        vHM_1[1] = pvHLoad[iVar62][0];
        for (end_query = 0; end_query < (int)(~((iVar1 + -1) / iVar57) + 0x10U);
            end_query = end_query + 1) {
          vH_1[0] = vH_1[0] << 8 | (ulong)vHM_1[1] >> 0x38;
          vHM_1[0] = vHM_1[0] << 8 | (ulong)vHS_1[1] >> 0x38;
          vHS_1[0] = vHS_1[0] << 8 | (ulong)vHL_1[1] >> 0x38;
          vHL_1[0] = vHL_1[0] << 8 | uStack_1038 >> 0x38;
          uStack_1038 = uStack_1038 << 8;
          vHL_1[1] = vHL_1[1] << 8;
          vHS_1[1] = vHS_1[1] << 8;
          vHM_1[1] = vHM_1[1] << 8;
        }
        local_db9 = vH_1[0]._7_1_;
        local_dba = vHM_1[0]._7_1_;
        local_dbb = vHS_1[0]._7_1_;
        local_dbc = vHL_1[0]._7_1_;
        local_c8 = (char)vSaturationCheckMax[1];
        cStack_c7 = (char)((ulong)vSaturationCheckMax[1] >> 8);
        cStack_c6 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
        cStack_c5 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
        cStack_c4 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
        cStack_c3 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
        cStack_c2 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
        cStack_c1 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
        cStack_c0 = (char)vSaturationCheckMin[0];
        cStack_bf = (char)((ulong)vSaturationCheckMin[0] >> 8);
        cStack_be = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
        cStack_bd = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
        cStack_bc = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
        cStack_bb = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
        cStack_ba = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
        cStack_b9 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
        local_1f8 = (char)result;
        cStack_1f7 = (char)((ulong)result >> 8);
        cStack_1f6 = (char)((ulong)result >> 0x10);
        cStack_1f5 = (char)((ulong)result >> 0x18);
        cStack_1f4 = (char)((ulong)result >> 0x20);
        cStack_1f3 = (char)((ulong)result >> 0x28);
        cStack_1f2 = (char)((ulong)result >> 0x30);
        cStack_1f1 = (char)((ulong)result >> 0x38);
        cStack_1f0 = (char)vSaturationCheckMax[0];
        cStack_1ef = (char)((ulong)vSaturationCheckMax[0] >> 8);
        cStack_1ee = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
        cStack_1ed = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
        cStack_1ec = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
        cStack_1eb = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
        cStack_1ea = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
        cStack_1e9 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
        uVar66 = CONCAT17(-(cStack_b9 < cVar55),
                          CONCAT16(-(cStack_ba < cVar55),
                                   CONCAT15(-(cStack_bb < cVar55),
                                            CONCAT14(-(cStack_bc < cVar55),
                                                     CONCAT13(-(cStack_bd < cVar55),
                                                              CONCAT12(-(cStack_be < cVar55),
                                                                       CONCAT11(-(cStack_bf < cVar55
                                                                                 ),-(cStack_c0 <
                                                                                    cVar55)))))))) |
                 CONCAT17(-(cVar56 < cStack_1e9),
                          CONCAT16(-(cVar56 < cStack_1ea),
                                   CONCAT15(-(cVar56 < cStack_1eb),
                                            CONCAT14(-(cVar56 < cStack_1ec),
                                                     CONCAT13(-(cVar56 < cStack_1ed),
                                                              CONCAT12(-(cVar56 < cStack_1ee),
                                                                       CONCAT11(-(cVar56 < 
                                                  cStack_1ef),-(cVar56 < cStack_1f0))))))));
        auVar45._8_8_ = uVar66;
        auVar45._0_8_ =
             CONCAT17(-(cStack_c1 < cVar55),
                      CONCAT16(-(cStack_c2 < cVar55),
                               CONCAT15(-(cStack_c3 < cVar55),
                                        CONCAT14(-(cStack_c4 < cVar55),
                                                 CONCAT13(-(cStack_c5 < cVar55),
                                                          CONCAT12(-(cStack_c6 < cVar55),
                                                                   CONCAT11(-(cStack_c7 < cVar55),
                                                                            -(local_c8 < cVar55)))))
                                       ))) |
             CONCAT17(-(cVar56 < cStack_1f1),
                      CONCAT16(-(cVar56 < cStack_1f2),
                               CONCAT15(-(cVar56 < cStack_1f3),
                                        CONCAT14(-(cVar56 < cStack_1f4),
                                                 CONCAT13(-(cVar56 < cStack_1f5),
                                                          CONCAT12(-(cVar56 < cStack_1f6),
                                                                   CONCAT11(-(cVar56 < cStack_1f7),
                                                                            -(cVar56 < local_1f8))))
                                                ))));
        if ((((((((((((((((auVar45 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar45 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar45 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar45 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar45 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar45 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar66 >> 7 & 1) != 0) || (uVar66 >> 0xf & 1) != 0) || (uVar66 >> 0x17 & 1) != 0)
               || (uVar66 >> 0x1f & 1) != 0) || (uVar66 >> 0x27 & 1) != 0) ||
             (uVar66 >> 0x2f & 1) != 0) || (uVar66 >> 0x37 & 1) != 0) || (long)uVar66 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_db9 = '\0';
          local_dba = '\0';
          local_dbb = '\0';
          local_dbc = '\0';
          local_cc8 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_db9;
        *(int *)((long)&_segNum->s1 + 4) = local_cc8;
        _segNum->s1Len = matrix._4_4_;
        *(int *)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->extra =
             (int)local_dba;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->similar =
             (int)local_dbb;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->length =
             (int)local_dbc;
        parasail_free(ptr_00);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLLoad);
        parasail_free(pvHLStore);
        parasail_free(pvHSLoad);
        parasail_free(pvHSStore);
        parasail_free(pvHMLoad);
        parasail_free(pvHMStore);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int8_t score = 0;
    int8_t matches = 0;
    int8_t similar = 0;
    int8_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile8.score;
    vProfileM = (__m128i*)profile->profile8.matches;
    vProfileS = (__m128i*)profile->profile8.similar;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi8(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 1);
        vHM = _mm_slli_si128(vHM, 1);
        vHS = _mm_slli_si128(vHS, 1);
        vHL = _mm_slli_si128(vHL, 1);

        /* insert upper boundary condition */
        vH = _mm_insert_epi8(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi8(vH_dag, vE);
            vH = _mm_max_epi8(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi8(vH, vH_dag);
            case2 = _mm_cmpeq_epi8(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi8(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi8(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi8(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_subs_epi8(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi8(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_adds_epi8(vEL, vOne),
                    _mm_adds_epi8(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi8(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi8(vFL, vOne),
                    _mm_adds_epi8(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 1);
            vF = _mm_slli_si128(vF, 1);
            vFM = _mm_slli_si128(vFM, 1);
            vFS = _mm_slli_si128(vFS, 1);
            vFL = _mm_slli_si128(vFL, 1);
            vHp = _mm_insert_epi8(vHp, boundary[j], 0);
            vF = _mm_insert_epi8(vF, tmp2, 0);
            vFL = _mm_insert_epi8(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_adds_epi8(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi8(vH, vHp);
                case2 = _mm_cmpeq_epi8(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_subs_epi8(vH, vGapO);
                vF_ext = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi8(vF_ext, vEF_opn),
                                _mm_cmpeq_epi8(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi8(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi8(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_adds_epi8(vFL, vOne),
                        _mm_adds_epi8(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 1);
                vHM = _mm_slli_si128 (vHM, 1);
                vHS = _mm_slli_si128 (vHS, 1);
                vHL = _mm_slli_si128 (vHL, 1);
            }
            result->stats->rowcols->score_row[j] = (int8_t) _mm_extract_epi8 (vH, 15);
            result->stats->rowcols->matches_row[j] = (int8_t) _mm_extract_epi8 (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int8_t) _mm_extract_epi8 (vHS, 15);
            result->stats->rowcols->length_row[j] = (int8_t) _mm_extract_epi8 (vHL, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 1);
            vHM = _mm_slli_si128 (vHM, 1);
            vHS = _mm_slli_si128 (vHS, 1);
            vHL = _mm_slli_si128 (vHL, 1);
        }
        score = (int8_t) _mm_extract_epi8 (vH, 15);
        matches = (int8_t) _mm_extract_epi8 (vHM, 15);
        similar = (int8_t) _mm_extract_epi8 (vHS, 15);
        length = (int8_t) _mm_extract_epi8 (vHL, 15);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}